

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void idct64_low32_ssse3(__m128i *input,__m128i *output)

{
  int8_t in_R8B;
  undefined4 uVar1;
  __m128i _in0;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i _in0_6;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  __m128i alVar420;
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar448 [16];
  undefined2 local_868;
  undefined2 uStack_866;
  undefined2 uStack_864;
  undefined2 uStack_862;
  undefined2 uStack_860;
  undefined2 uStack_85e;
  undefined2 uStack_85c;
  undefined2 uStack_85a;
  undefined2 local_848;
  undefined2 uStack_846;
  undefined2 uStack_844;
  undefined2 uStack_842;
  undefined2 uStack_840;
  undefined2 uStack_83e;
  undefined2 uStack_83c;
  undefined2 uStack_83a;
  undefined2 local_7a8;
  undefined2 uStack_7a6;
  undefined2 uStack_7a4;
  undefined2 uStack_7a2;
  undefined2 uStack_7a0;
  undefined2 uStack_79e;
  undefined2 uStack_79c;
  undefined2 uStack_79a;
  undefined2 local_798;
  undefined2 uStack_796;
  undefined2 uStack_794;
  undefined2 uStack_792;
  undefined2 uStack_790;
  undefined2 uStack_78e;
  undefined2 uStack_78c;
  undefined2 uStack_78a;
  undefined2 local_758;
  undefined2 uStack_756;
  undefined2 uStack_754;
  undefined2 uStack_752;
  undefined2 uStack_750;
  undefined2 uStack_74e;
  undefined2 uStack_74c;
  undefined2 uStack_74a;
  undefined2 local_728;
  undefined2 uStack_726;
  undefined2 uStack_724;
  undefined2 uStack_722;
  undefined2 uStack_720;
  undefined2 uStack_71e;
  undefined2 uStack_71c;
  undefined2 uStack_71a;
  undefined2 local_718;
  undefined2 uStack_716;
  undefined2 uStack_714;
  undefined2 uStack_712;
  undefined2 uStack_710;
  undefined2 uStack_70e;
  undefined2 uStack_70c;
  undefined2 uStack_70a;
  undefined2 local_608;
  undefined2 uStack_606;
  undefined2 uStack_604;
  undefined2 uStack_602;
  undefined2 uStack_600;
  undefined2 uStack_5fe;
  undefined2 uStack_5fc;
  undefined2 uStack_5fa;
  undefined2 local_5f8;
  undefined2 uStack_5f6;
  undefined2 uStack_5f4;
  undefined2 uStack_5f2;
  undefined2 uStack_5f0;
  undefined2 uStack_5ee;
  undefined2 uStack_5ec;
  undefined2 uStack_5ea;
  undefined2 local_5e8;
  undefined2 uStack_5e6;
  undefined2 uStack_5e4;
  undefined2 uStack_5e2;
  undefined2 uStack_5e0;
  undefined2 uStack_5de;
  undefined2 uStack_5dc;
  undefined2 uStack_5da;
  undefined2 local_5d8;
  undefined2 uStack_5d6;
  undefined2 uStack_5d4;
  undefined2 uStack_5d2;
  undefined2 uStack_5d0;
  undefined2 uStack_5ce;
  undefined2 uStack_5cc;
  undefined2 uStack_5ca;
  undefined2 local_5b8;
  undefined2 uStack_5b6;
  undefined2 uStack_5b4;
  undefined2 uStack_5b2;
  undefined2 uStack_5b0;
  undefined2 uStack_5ae;
  undefined2 uStack_5ac;
  undefined2 uStack_5aa;
  undefined2 local_5a8;
  undefined2 uStack_5a6;
  undefined2 uStack_5a4;
  undefined2 uStack_5a2;
  undefined2 uStack_5a0;
  undefined2 uStack_59e;
  undefined2 uStack_59c;
  undefined2 uStack_59a;
  undefined2 local_598;
  undefined2 uStack_596;
  undefined2 uStack_594;
  undefined2 uStack_592;
  undefined2 uStack_590;
  undefined2 uStack_58e;
  undefined2 uStack_58c;
  undefined2 uStack_58a;
  undefined2 local_588;
  undefined2 uStack_586;
  undefined2 uStack_584;
  undefined2 uStack_582;
  undefined2 uStack_580;
  undefined2 uStack_57e;
  undefined2 uStack_57c;
  undefined2 uStack_57a;
  undefined2 local_578;
  undefined2 uStack_576;
  undefined2 uStack_574;
  undefined2 uStack_572;
  undefined2 uStack_570;
  undefined2 uStack_56e;
  undefined2 uStack_56c;
  undefined2 uStack_56a;
  undefined2 local_568;
  undefined2 uStack_566;
  undefined2 uStack_564;
  undefined2 uStack_562;
  undefined2 uStack_560;
  undefined2 uStack_55e;
  undefined2 uStack_55c;
  undefined2 uStack_55a;
  undefined2 local_558;
  undefined2 uStack_556;
  undefined2 uStack_554;
  undefined2 uStack_552;
  undefined2 uStack_550;
  undefined2 uStack_54e;
  undefined2 uStack_54c;
  undefined2 uStack_54a;
  undefined2 local_548;
  undefined2 uStack_546;
  undefined2 uStack_544;
  undefined2 uStack_542;
  undefined2 uStack_540;
  undefined2 uStack_53e;
  undefined2 uStack_53c;
  undefined2 uStack_53a;
  undefined2 local_4e8;
  undefined2 uStack_4e6;
  undefined2 uStack_4e4;
  undefined2 uStack_4e2;
  undefined2 uStack_4e0;
  undefined2 uStack_4de;
  undefined2 uStack_4dc;
  undefined2 uStack_4da;
  undefined2 local_4d8;
  undefined2 uStack_4d6;
  undefined2 uStack_4d4;
  undefined2 uStack_4d2;
  undefined2 uStack_4d0;
  undefined2 uStack_4ce;
  undefined2 uStack_4cc;
  undefined2 uStack_4ca;
  undefined2 local_4c8;
  undefined2 uStack_4c6;
  undefined2 uStack_4c4;
  undefined2 uStack_4c2;
  undefined2 uStack_4c0;
  undefined2 uStack_4be;
  undefined2 uStack_4bc;
  undefined2 uStack_4ba;
  undefined2 local_4a8;
  undefined2 uStack_4a6;
  undefined2 uStack_4a4;
  undefined2 uStack_4a2;
  undefined2 uStack_4a0;
  undefined2 uStack_49e;
  undefined2 uStack_49c;
  undefined2 uStack_49a;
  undefined2 local_498;
  undefined2 uStack_496;
  undefined2 uStack_494;
  undefined2 uStack_492;
  undefined2 uStack_490;
  undefined2 uStack_48e;
  undefined2 uStack_48c;
  undefined2 uStack_48a;
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined2 uStack_480;
  undefined2 uStack_47e;
  undefined2 uStack_47c;
  undefined2 uStack_47a;
  longlong local_438;
  longlong lStack_430;
  longlong local_418;
  longlong lStack_410;
  __m128i local_3f8;
  longlong local_3d8;
  longlong lStack_3d0;
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar26 [16];
  undefined1 auVar34 [16];
  undefined1 auVar52 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar27 [16];
  undefined1 auVar35 [16];
  undefined1 auVar53 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined1 auVar28 [16];
  undefined1 auVar36 [16];
  undefined1 auVar54 [16];
  undefined1 auVar91 [16];
  undefined1 auVar96 [16];
  undefined1 auVar109 [16];
  undefined1 auVar92 [16];
  undefined1 auVar97 [16];
  undefined1 auVar110 [16];
  undefined1 auVar93 [16];
  undefined1 auVar98 [16];
  undefined1 auVar111 [16];
  undefined1 auVar135 [16];
  undefined1 auVar143 [16];
  undefined1 auVar148 [16];
  undefined1 auVar136 [16];
  undefined1 auVar144 [16];
  undefined1 auVar149 [16];
  undefined1 auVar137 [16];
  undefined1 auVar145 [16];
  undefined1 auVar150 [16];
  undefined1 auVar173 [16];
  undefined1 auVar178 [16];
  undefined1 auVar174 [16];
  undefined1 auVar179 [16];
  undefined1 auVar175 [16];
  undefined1 auVar180 [16];
  undefined1 auVar200 [16];
  undefined1 auVar207 [16];
  undefined1 auVar213 [16];
  undefined1 auVar227 [16];
  undefined1 auVar235 [16];
  undefined1 auVar201 [16];
  undefined1 auVar208 [16];
  undefined1 auVar214 [16];
  undefined1 auVar228 [16];
  undefined1 auVar236 [16];
  undefined1 auVar202 [16];
  undefined1 auVar209 [16];
  undefined1 auVar215 [16];
  undefined1 auVar229 [16];
  undefined1 auVar237 [16];
  undefined1 auVar263 [16];
  undefined1 auVar271 [16];
  undefined1 auVar276 [16];
  undefined1 auVar281 [16];
  undefined1 auVar264 [16];
  undefined1 auVar272 [16];
  undefined1 auVar277 [16];
  undefined1 auVar282 [16];
  undefined1 auVar265 [16];
  undefined1 auVar273 [16];
  undefined1 auVar278 [16];
  undefined1 auVar283 [16];
  undefined1 auVar316 [16];
  undefined1 auVar326 [16];
  undefined1 auVar317 [16];
  undefined1 auVar327 [16];
  undefined1 auVar318 [16];
  undefined1 auVar328 [16];
  undefined1 auVar335 [16];
  undefined1 auVar341 [16];
  undefined1 auVar346 [16];
  undefined1 auVar336 [16];
  undefined1 auVar342 [16];
  undefined1 auVar347 [16];
  undefined1 auVar337 [16];
  undefined1 auVar343 [16];
  undefined1 auVar348 [16];
  undefined1 auVar362 [16];
  undefined1 auVar367 [16];
  undefined1 auVar363 [16];
  undefined1 auVar368 [16];
  undefined1 auVar364 [16];
  undefined1 auVar369 [16];
  undefined1 auVar375 [16];
  undefined1 auVar382 [16];
  undefined1 auVar376 [16];
  undefined1 auVar383 [16];
  undefined1 auVar377 [16];
  undefined1 auVar384 [16];
  undefined1 auVar400 [16];
  undefined1 auVar406 [16];
  undefined1 auVar412 [16];
  undefined1 auVar401 [16];
  undefined1 auVar407 [16];
  undefined1 auVar413 [16];
  undefined1 auVar402 [16];
  undefined1 auVar408 [16];
  undefined1 auVar414 [16];
  undefined1 auVar427 [16];
  undefined1 auVar432 [16];
  undefined1 auVar428 [16];
  undefined1 auVar433 [16];
  undefined1 auVar429 [16];
  undefined1 auVar434 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  
  local_438 = (*input)[0];
  lStack_430 = (*input)[1];
  local_418 = input[0x10][0];
  lStack_410 = input[0x10][1];
  local_3f8 = input[8];
  local_3d8 = input[0x18][0];
  lStack_3d0 = input[0x18][1];
  auVar251 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar1 = auVar251._0_4_;
  auVar291._4_4_ = uVar1;
  auVar291._0_4_ = uVar1;
  auVar291._8_4_ = uVar1;
  auVar291._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  auVar252._0_4_ = auVar251._0_4_;
  auVar252._4_4_ = auVar252._0_4_;
  auVar252._8_4_ = auVar252._0_4_;
  auVar252._12_4_ = auVar252._0_4_;
  auVar292 = pmulhrsw(auVar291,(undefined1  [16])input[1]);
  auVar253 = pmulhrsw(auVar252,(undefined1  [16])input[1]);
  auVar251 = pshuflw(ZEXT416(0xffffa7c0),ZEXT416(0xffffa7c0),0);
  uVar1 = auVar251._0_4_;
  auVar254._4_4_ = uVar1;
  auVar254._0_4_ = uVar1;
  auVar254._8_4_ = uVar1;
  auVar254._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x5cb8),ZEXT416(0x5cb8),0);
  auVar239._0_4_ = auVar251._0_4_;
  auVar239._4_4_ = auVar239._0_4_;
  auVar239._8_4_ = auVar239._0_4_;
  auVar239._12_4_ = auVar239._0_4_;
  auVar255 = pmulhrsw(auVar254,(undefined1  [16])input[0x1f]);
  auVar240 = pmulhrsw(auVar239,(undefined1  [16])input[0x1f]);
  auVar251 = pshuflw(ZEXT416(0x33e0),ZEXT416(0x33e0),0);
  uVar1 = auVar251._0_4_;
  auVar241._4_4_ = uVar1;
  auVar241._0_4_ = uVar1;
  auVar241._8_4_ = uVar1;
  auVar241._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7508),ZEXT416(0x7508),0);
  auVar187._0_4_ = auVar251._0_4_;
  auVar187._4_4_ = auVar187._0_4_;
  auVar187._8_4_ = auVar187._0_4_;
  auVar187._12_4_ = auVar187._0_4_;
  auVar242 = pmulhrsw(auVar241,(undefined1  [16])input[0x11]);
  auVar188 = pmulhrsw(auVar187,(undefined1  [16])input[0x11]);
  auVar251 = pshuflw(ZEXT416(0xffffd1f0),ZEXT416(0xffffd1f0),0);
  uVar1 = auVar251._0_4_;
  auVar189._4_4_ = uVar1;
  auVar189._0_4_ = uVar1;
  auVar189._8_4_ = uVar1;
  auVar189._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7770),ZEXT416(0x7770),0);
  auVar154._0_4_ = auVar251._0_4_;
  auVar154._4_4_ = auVar154._0_4_;
  auVar154._8_4_ = auVar154._0_4_;
  auVar154._12_4_ = auVar154._0_4_;
  auVar190 = pmulhrsw(auVar189,(undefined1  [16])input[0xf]);
  auVar155 = pmulhrsw(auVar154,(undefined1  [16])input[0xf]);
  auVar251 = pshuflw(ZEXT416(0x1c08),ZEXT416(0x1c08),0);
  uVar1 = auVar251._0_4_;
  auVar156._4_4_ = uVar1;
  auVar156._0_4_ = uVar1;
  auVar156._8_4_ = uVar1;
  auVar156._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7ce0),ZEXT416(0x7ce0),0);
  auVar117._0_4_ = auVar251._0_4_;
  auVar117._4_4_ = auVar117._0_4_;
  auVar117._8_4_ = auVar117._0_4_;
  auVar117._12_4_ = auVar117._0_4_;
  auVar157 = pmulhrsw(auVar156,(undefined1  [16])input[9]);
  auVar118 = pmulhrsw(auVar117,(undefined1  [16])input[9]);
  auVar251 = pshuflw(ZEXT416(0xffffbb88),ZEXT416(0xffffbb88),0);
  uVar1 = auVar251._0_4_;
  auVar119._4_4_ = uVar1;
  auVar119._0_4_ = uVar1;
  auVar119._8_4_ = uVar1;
  auVar119._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x6c28),ZEXT416(0x6c28),0);
  auVar71._0_4_ = auVar251._0_4_;
  auVar71._4_4_ = auVar71._0_4_;
  auVar71._8_4_ = auVar71._0_4_;
  auVar71._12_4_ = auVar71._0_4_;
  auVar120 = pmulhrsw(auVar119,(undefined1  [16])input[0x17]);
  auVar72 = pmulhrsw(auVar71,(undefined1  [16])input[0x17]);
  auVar251 = pshuflw(ZEXT416(0x49b8),ZEXT416(0x49b8),0);
  uVar1 = auVar251._0_4_;
  auVar73._4_4_ = uVar1;
  auVar73._0_4_ = uVar1;
  auVar73._8_4_ = uVar1;
  auVar73._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x68a8),ZEXT416(0x68a8),0);
  auVar170._0_4_ = auVar251._0_4_;
  auVar170._4_4_ = auVar170._0_4_;
  auVar170._8_4_ = auVar170._0_4_;
  auVar170._12_4_ = auVar170._0_4_;
  auVar74 = pmulhrsw(auVar73,(undefined1  [16])input[0x19]);
  auVar2 = pmulhrsw(auVar170,(undefined1  [16])input[0x19]);
  auVar251 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  uVar1 = auVar251._0_4_;
  auVar75._4_4_ = uVar1;
  auVar75._0_4_ = uVar1;
  auVar75._8_4_ = uVar1;
  auVar75._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  uVar1 = auVar251._0_4_;
  auVar221._4_4_ = uVar1;
  auVar221._0_4_ = uVar1;
  auVar221._8_4_ = uVar1;
  auVar221._12_4_ = uVar1;
  auVar76 = pmulhrsw(auVar75,(undefined1  [16])input[7]);
  auVar3 = pmulhrsw(auVar221,(undefined1  [16])input[7]);
  auVar251 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar1 = auVar251._0_4_;
  auVar421._4_4_ = uVar1;
  auVar421._0_4_ = uVar1;
  auVar421._8_4_ = uVar1;
  auVar421._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  uVar1 = auVar251._0_4_;
  auVar220._4_4_ = uVar1;
  auVar220._0_4_ = uVar1;
  auVar220._8_4_ = uVar1;
  auVar220._12_4_ = uVar1;
  auVar422 = pmulhrsw(auVar421,(undefined1  [16])input[5]);
  auVar4 = pmulhrsw(auVar220,(undefined1  [16])input[5]);
  auVar251 = pshuflw(ZEXT416(0xffffb140),ZEXT416(0xffffb140),0);
  uVar1 = auVar251._0_4_;
  auVar77._4_4_ = uVar1;
  auVar77._0_4_ = uVar1;
  auVar77._8_4_ = uVar1;
  auVar77._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x64e8),ZEXT416(0x64e8),0);
  uVar1 = auVar251._0_4_;
  auVar248._4_4_ = uVar1;
  auVar248._0_4_ = uVar1;
  auVar248._8_4_ = uVar1;
  auVar248._12_4_ = uVar1;
  auVar78 = pmulhrsw(auVar77,(undefined1  [16])input[0x1b]);
  auVar5 = pmulhrsw(auVar248,(undefined1  [16])input[0x1b]);
  auVar251 = pshuflw(ZEXT416(0x3f18),ZEXT416(0x3f18),0);
  uVar1 = auVar251._0_4_;
  auVar79._4_4_ = uVar1;
  auVar79._0_4_ = uVar1;
  auVar79._8_4_ = uVar1;
  auVar79._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x6f60),ZEXT416(0x6f60),0);
  uVar1 = auVar251._0_4_;
  auVar249._4_4_ = uVar1;
  auVar249._0_4_ = uVar1;
  auVar249._8_4_ = uVar1;
  auVar249._12_4_ = uVar1;
  auVar80 = pmulhrsw(auVar79,(undefined1  [16])input[0x15]);
  auVar6 = pmulhrsw(auVar249,(undefined1  [16])input[0x15]);
  auVar251 = pshuflw(ZEXT416(0xffffdde0),ZEXT416(0xffffdde0),0);
  uVar1 = auVar251._0_4_;
  auVar306._4_4_ = uVar1;
  auVar306._0_4_ = uVar1;
  auVar306._8_4_ = uVar1;
  auVar306._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7b60),ZEXT416(0x7b60),0);
  uVar1 = auVar251._0_4_;
  auVar371._4_4_ = uVar1;
  auVar371._0_4_ = uVar1;
  auVar371._8_4_ = uVar1;
  auVar371._12_4_ = uVar1;
  auVar307 = pmulhrsw(auVar306,(undefined1  [16])input[0xb]);
  auVar372 = pmulhrsw(auVar371,(undefined1  [16])input[0xb]);
  auVar251 = pshuflw(ZEXT416(0x2828),ZEXT416(0x2828),0);
  uVar1 = auVar251._0_4_;
  auVar293._4_4_ = uVar1;
  auVar293._0_4_ = uVar1;
  auVar293._8_4_ = uVar1;
  auVar293._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7988),ZEXT416(0x7988),0);
  uVar1 = auVar251._0_4_;
  auVar250._4_4_ = uVar1;
  auVar250._0_4_ = uVar1;
  auVar250._8_4_ = uVar1;
  auVar250._12_4_ = uVar1;
  auVar294 = pmulhrsw(auVar293,(undefined1  [16])input[0xd]);
  auVar7 = pmulhrsw(auVar250,(undefined1  [16])input[0xd]);
  auVar251 = pshuflw(ZEXT416(0xffffc670),ZEXT416(0xffffc670),0);
  uVar1 = auVar251._0_4_;
  auVar267._4_4_ = uVar1;
  auVar267._0_4_ = uVar1;
  auVar267._8_4_ = uVar1;
  auVar267._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7258),ZEXT416(0x7258),0);
  uVar1 = auVar251._0_4_;
  auVar243._4_4_ = uVar1;
  auVar243._0_4_ = uVar1;
  auVar243._8_4_ = uVar1;
  auVar243._12_4_ = uVar1;
  auVar8 = pmulhrsw(auVar267,(undefined1  [16])input[0x13]);
  auVar244 = pmulhrsw(auVar243,(undefined1  [16])input[0x13]);
  auVar251 = pshuflw(ZEXT416(0x5398),ZEXT416(0x5398),0);
  uVar1 = auVar251._0_4_;
  auVar298._4_4_ = uVar1;
  auVar298._0_4_ = uVar1;
  auVar298._8_4_ = uVar1;
  auVar298._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x60f0),ZEXT416(0x60f0),0);
  uVar1 = auVar251._0_4_;
  auVar81._4_4_ = uVar1;
  auVar81._0_4_ = uVar1;
  auVar81._8_4_ = uVar1;
  auVar81._12_4_ = uVar1;
  auVar9 = pmulhrsw(auVar298,(undefined1  [16])input[0x1d]);
  auVar82 = pmulhrsw(auVar81,(undefined1  [16])input[0x1d]);
  auVar251 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar1 = auVar251._0_4_;
  auVar158._4_4_ = uVar1;
  auVar158._0_4_ = uVar1;
  auVar158._8_4_ = uVar1;
  auVar158._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  uVar1 = auVar251._0_4_;
  auVar191._4_4_ = uVar1;
  auVar191._0_4_ = uVar1;
  auVar191._8_4_ = uVar1;
  auVar191._12_4_ = uVar1;
  auVar159 = pmulhrsw(auVar158,(undefined1  [16])input[3]);
  auVar192 = pmulhrsw(auVar191,(undefined1  [16])input[3]);
  auVar251 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar1 = auVar251._0_4_;
  auVar299._4_4_ = uVar1;
  auVar299._0_4_ = uVar1;
  auVar299._8_4_ = uVar1;
  auVar299._12_4_ = uVar1;
  auVar251 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar1 = auVar251._0_4_;
  auVar85._4_4_ = uVar1;
  auVar85._0_4_ = uVar1;
  auVar85._8_4_ = uVar1;
  auVar85._12_4_ = uVar1;
  auVar10 = pmulhrsw(auVar299,(undefined1  [16])input[2]);
  auVar251 = pmulhrsw(auVar85,(undefined1  [16])input[2]);
  auVar83 = pshuflw(ZEXT416(0xffffaa08),ZEXT416(0xffffaa08),0);
  uVar1 = auVar83._0_4_;
  auVar355._4_4_ = uVar1;
  auVar355._0_4_ = uVar1;
  auVar355._8_4_ = uVar1;
  auVar355._12_4_ = uVar1;
  auVar83 = pshuflw(ZEXT416(0x5ed8),ZEXT416(0x5ed8),0);
  uVar1 = auVar83._0_4_;
  auVar86._4_4_ = uVar1;
  auVar86._0_4_ = uVar1;
  auVar86._8_4_ = uVar1;
  auVar86._12_4_ = uVar1;
  auVar11 = pmulhrsw(auVar355,(undefined1  [16])input[0x1e]);
  auVar83 = pmulhrsw(auVar86,(undefined1  [16])input[0x1e]);
  auVar84 = pshuflw(ZEXT416(0x36b8),ZEXT416(0x36b8),0);
  uVar1 = auVar84._0_4_;
  auVar388._4_4_ = uVar1;
  auVar388._0_4_ = uVar1;
  auVar388._8_4_ = uVar1;
  auVar388._12_4_ = uVar1;
  auVar84 = pshuflw(ZEXT416(0x73b8),ZEXT416(0x73b8),0);
  uVar1 = auVar84._0_4_;
  auVar87._4_4_ = uVar1;
  auVar87._0_4_ = uVar1;
  auVar87._8_4_ = uVar1;
  auVar87._12_4_ = uVar1;
  auVar12 = pmulhrsw(auVar388,(undefined1  [16])input[0x12]);
  auVar84 = pmulhrsw(auVar87,(undefined1  [16])input[0x12]);
  auVar85 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar1 = auVar85._0_4_;
  auVar386._4_4_ = uVar1;
  auVar386._0_4_ = uVar1;
  auVar386._8_4_ = uVar1;
  auVar386._12_4_ = uVar1;
  auVar85 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar1 = auVar85._0_4_;
  auVar436._4_4_ = uVar1;
  auVar436._0_4_ = uVar1;
  auVar436._8_4_ = uVar1;
  auVar436._12_4_ = uVar1;
  auVar387 = pmulhrsw(auVar386,(undefined1  [16])input[0xe]);
  auVar437 = pmulhrsw(auVar436,(undefined1  [16])input[0xe]);
  auVar85 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar1 = auVar85._0_4_;
  auVar350._4_4_ = uVar1;
  auVar350._0_4_ = uVar1;
  auVar350._8_4_ = uVar1;
  auVar350._12_4_ = uVar1;
  auVar85 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  uVar1 = auVar85._0_4_;
  auVar88._4_4_ = uVar1;
  auVar88._0_4_ = uVar1;
  auVar88._8_4_ = uVar1;
  auVar88._12_4_ = uVar1;
  auVar351 = pmulhrsw(auVar350,(undefined1  [16])input[10]);
  auVar85 = pmulhrsw(auVar88,(undefined1  [16])input[10]);
  auVar86 = pshuflw(ZEXT416(0xffffbe30),ZEXT416(0xffffbe30),0);
  uVar1 = auVar86._0_4_;
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar86 = pshuflw(ZEXT416(0x6dc8),ZEXT416(0x6dc8),0);
  uVar1 = auVar86._0_4_;
  auVar330._4_4_ = uVar1;
  auVar330._0_4_ = uVar1;
  auVar330._8_4_ = uVar1;
  auVar330._12_4_ = uVar1;
  auVar86 = pmulhrsw(auVar13,(undefined1  [16])input[0x16]);
  auVar331 = pmulhrsw(auVar330,(undefined1  [16])input[0x16]);
  auVar87 = pshuflw(ZEXT416(0x4c40),ZEXT416(0x4c40),0);
  uVar1 = auVar87._0_4_;
  auVar122._4_4_ = uVar1;
  auVar122._0_4_ = uVar1;
  auVar122._8_4_ = uVar1;
  auVar122._12_4_ = uVar1;
  auVar87 = pshuflw(ZEXT416(0x66d0),ZEXT416(0x66d0),0);
  uVar1 = auVar87._0_4_;
  auVar440._4_4_ = uVar1;
  auVar440._0_4_ = uVar1;
  auVar440._8_4_ = uVar1;
  auVar440._12_4_ = uVar1;
  auVar87 = pmulhrsw(auVar122,(undefined1  [16])input[0x1a]);
  auVar13 = pmulhrsw(auVar440,(undefined1  [16])input[0x1a]);
  auVar88 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar1 = auVar88._0_4_;
  auVar256._4_4_ = uVar1;
  auVar256._0_4_ = uVar1;
  auVar256._8_4_ = uVar1;
  auVar256._12_4_ = uVar1;
  auVar88 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  auVar121._0_4_ = auVar88._0_4_;
  auVar121._4_4_ = auVar121._0_4_;
  auVar121._8_4_ = auVar121._0_4_;
  auVar121._12_4_ = auVar121._0_4_;
  auVar257 = pmulhrsw(auVar256,(undefined1  [16])input[6]);
  auVar122 = pmulhrsw(auVar121,(undefined1  [16])input[6]);
  local_238 = paddsw(auVar292,auVar255);
  local_228 = psubsw(auVar292,auVar255);
  local_218 = psubsw(auVar190,auVar242);
  local_208 = paddsw(auVar190,auVar242);
  local_1f8 = paddsw(auVar157,auVar120);
  local_1e8 = psubsw(auVar157,auVar120);
  local_1d8 = psubsw(auVar76,auVar74);
  local_1c8 = paddsw(auVar76,auVar74);
  local_1b8 = paddsw(auVar422,auVar78);
  local_1a8 = psubsw(auVar422,auVar78);
  local_198 = psubsw(auVar307,auVar80);
  local_188 = paddsw(auVar307,auVar80);
  local_178 = paddsw(auVar294,auVar8);
  local_168 = psubsw(auVar294,auVar8);
  local_158 = psubsw(auVar159,auVar9);
  local_148 = paddsw(auVar159,auVar9);
  local_138 = paddsw(auVar192,auVar82);
  local_128 = psubsw(auVar192,auVar82);
  local_118 = psubsw(auVar7,auVar244);
  local_108 = paddsw(auVar244,auVar7);
  local_f8 = paddsw(auVar372,auVar6);
  local_e8 = psubsw(auVar372,auVar6);
  local_d8 = psubsw(auVar4,auVar5);
  local_c8 = paddsw(auVar5,auVar4);
  local_b8 = paddsw(auVar3,auVar2);
  local_a8 = psubsw(auVar3,auVar2);
  local_98 = psubsw(auVar118,auVar72);
  local_88 = paddsw(auVar72,auVar118);
  local_78 = paddsw(auVar155,auVar188);
  local_68 = psubsw(auVar155,auVar188);
  local_58 = psubsw(auVar253,auVar240);
  local_48 = paddsw(auVar240,auVar253);
  auVar88 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar1 = auVar88._0_4_;
  auVar193._4_4_ = uVar1;
  auVar193._0_4_ = uVar1;
  auVar193._8_4_ = uVar1;
  auVar193._12_4_ = uVar1;
  local_3b8 = pmulhrsw(auVar193,(undefined1  [16])input[4]);
  auVar88 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar194._0_4_ = auVar88._0_4_;
  auVar194._4_4_ = auVar194._0_4_;
  auVar194._8_4_ = auVar194._0_4_;
  auVar194._12_4_ = auVar194._0_4_;
  local_348 = pmulhrsw(auVar194,(undefined1  [16])input[4]);
  auVar88 = pshuflw(ZEXT416(0xffffaed0),ZEXT416(0xffffaed0),0);
  auVar195._0_4_ = auVar88._0_4_;
  auVar195._4_4_ = auVar195._0_4_;
  auVar195._8_4_ = auVar195._0_4_;
  auVar195._12_4_ = auVar195._0_4_;
  local_3a8 = pmulhrsw(auVar195,(undefined1  [16])input[0x1c]);
  auVar88 = pshuflw(ZEXT416(0x62f0),ZEXT416(0x62f0),0);
  auVar196._0_4_ = auVar88._0_4_;
  auVar196._4_4_ = auVar196._0_4_;
  auVar196._8_4_ = auVar196._0_4_;
  auVar196._12_4_ = auVar196._0_4_;
  local_358 = pmulhrsw(auVar196,(undefined1  [16])input[0x1c]);
  auVar88 = pshuflw(ZEXT416(0x3c58),ZEXT416(0x3c58),0);
  auVar160._0_4_ = auVar88._0_4_;
  auVar160._4_4_ = auVar160._0_4_;
  auVar160._8_4_ = auVar160._0_4_;
  auVar160._12_4_ = auVar160._0_4_;
  local_398 = pmulhrsw(auVar160,(undefined1  [16])input[0x14]);
  auVar88 = pshuflw(ZEXT416(0x70e0),ZEXT416(0x70e0),0);
  auVar161._0_4_ = auVar88._0_4_;
  auVar161._4_4_ = auVar161._0_4_;
  auVar161._8_4_ = auVar161._0_4_;
  auVar161._12_4_ = auVar161._0_4_;
  local_368 = pmulhrsw(auVar161,(undefined1  [16])input[0x14]);
  auVar88 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  auVar441._0_4_ = auVar88._0_4_;
  auVar441._4_4_ = auVar441._0_4_;
  auVar441._8_4_ = auVar441._0_4_;
  auVar441._12_4_ = auVar441._0_4_;
  local_388 = pmulhrsw(auVar441,(undefined1  [16])input[0xc]);
  auVar88 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  auVar314._0_4_ = auVar88._0_4_;
  auVar314._4_4_ = auVar314._0_4_;
  auVar314._8_4_ = auVar314._0_4_;
  auVar314._12_4_ = auVar314._0_4_;
  local_378 = pmulhrsw(auVar314,(undefined1  [16])input[0xc]);
  local_338 = paddsw(auVar10,auVar11);
  local_328 = psubsw(auVar10,auVar11);
  local_318 = psubsw(auVar387,auVar12);
  local_308 = paddsw(auVar387,auVar12);
  local_2f8 = paddsw(auVar351,auVar86);
  local_2e8 = psubsw(auVar351,auVar86);
  local_2d8 = psubsw(auVar257,auVar87);
  local_2c8 = paddsw(auVar257,auVar87);
  local_2b8 = paddsw(auVar122,auVar13);
  local_2a8 = psubsw(auVar122,auVar13);
  local_298 = psubsw(auVar85,auVar331);
  local_288 = paddsw(auVar331,auVar85);
  local_278 = paddsw(auVar437,auVar84);
  local_268 = psubsw(auVar437,auVar84);
  local_258 = psubsw(auVar251,auVar83);
  local_248 = paddsw(auVar83,auVar251);
  alVar420[1]._0_4_ = 0xb50f4b0;
  alVar420[0] = 0xb50;
  alVar420[1]._4_4_ = 0;
  idct64_stage4_high32_sse2((__m128i *)&local_438,(int32_t *)0xec8061f,alVar420,in_R8B);
  auVar251 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar1 = auVar251._0_4_;
  auVar197._4_4_ = uVar1;
  auVar197._0_4_ = uVar1;
  auVar197._8_4_ = uVar1;
  auVar197._12_4_ = uVar1;
  auVar251 = pshuflw(auVar251,ZEXT416(0x7d88),0);
  uVar1 = auVar251._0_4_;
  auVar162._4_4_ = uVar1;
  auVar162._0_4_ = uVar1;
  auVar162._8_4_ = uVar1;
  auVar162._12_4_ = uVar1;
  auVar84._8_8_ = lStack_3d0;
  auVar84._0_8_ = local_3d8;
  auVar12 = pmulhrsw(auVar197,(undefined1  [16])local_3f8);
  auVar11 = pmulhrsw(auVar162,(undefined1  [16])local_3f8);
  auVar251 = pshuflw((undefined1  [16])local_3f8,ZEXT416(0xffffb8e0),0);
  uVar1 = auVar251._0_4_;
  auVar89._4_4_ = uVar1;
  auVar89._0_4_ = uVar1;
  auVar89._8_4_ = uVar1;
  auVar89._12_4_ = uVar1;
  auVar251 = pshuflw(auVar251,ZEXT416(0x6a70),0);
  auVar2._0_4_ = auVar251._0_4_;
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar122 = pmulhrsw(auVar89,auVar84);
  auVar251 = pmulhrsw(auVar2,auVar84);
  auVar74 = paddsw(local_3b8,local_3a8);
  auVar253 = psubsw(local_3b8,local_3a8);
  auVar351 = psubsw(local_388,local_398);
  auVar76 = paddsw(local_388,local_398);
  auVar78 = paddsw(local_378,local_368);
  auVar72 = psubsw(local_378,local_368);
  auVar2 = psubsw(local_348,local_358);
  auVar80 = paddsw(local_348,local_358);
  auVar93._0_12_ = local_328._0_12_;
  auVar93._12_2_ = local_328._6_2_;
  auVar93._14_2_ = local_258._6_2_;
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._0_10_ = local_328._0_10_;
  auVar92._10_2_ = local_258._4_2_;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._0_8_ = local_328._0_8_;
  auVar91._8_2_ = local_328._4_2_;
  auVar90._8_8_ = auVar91._8_8_;
  auVar90._6_2_ = local_258._2_2_;
  auVar90._4_2_ = local_328._2_2_;
  auVar90._0_2_ = local_328._0_2_;
  auVar90._2_2_ = local_258._0_2_;
  auVar3._2_2_ = local_258._8_2_;
  auVar3._0_2_ = local_328._8_2_;
  auVar3._4_2_ = local_328._10_2_;
  auVar3._6_2_ = local_258._10_2_;
  auVar3._8_2_ = local_328._12_2_;
  auVar3._10_2_ = local_258._12_2_;
  auVar3._12_2_ = local_328._14_2_;
  auVar3._14_2_ = local_258._14_2_;
  auVar123._8_4_ = 0x31ff04f;
  auVar123._0_8_ = 0x31ff04f031ff04f;
  auVar123._12_4_ = 0x31ff04f;
  auVar84 = pmaddwd(auVar90,auVar123);
  auVar83 = pmaddwd(auVar3,auVar123);
  auVar163._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar163._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar163._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar163._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar379._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar379._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar379._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar379._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar159 = packssdw(auVar163,auVar379);
  auVar339._8_4_ = 0xfb1031f;
  auVar339._0_8_ = 0xfb1031f0fb1031f;
  auVar339._12_4_ = 0xfb1031f;
  auVar84 = pmaddwd(auVar90,auVar339);
  auVar83 = pmaddwd(auVar3,auVar339);
  auVar94._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar94._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar94._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar94._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar4._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar4._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar4._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar4._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar240 = packssdw(auVar94,auVar4);
  auVar98._0_12_ = local_318._0_12_;
  auVar98._12_2_ = local_318._6_2_;
  auVar98._14_2_ = local_268._6_2_;
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._0_10_ = local_318._0_10_;
  auVar97._10_2_ = local_268._4_2_;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._0_8_ = local_318._0_8_;
  auVar96._8_2_ = local_318._4_2_;
  auVar95._8_8_ = auVar96._8_8_;
  auVar95._6_2_ = local_268._2_2_;
  auVar95._4_2_ = local_318._2_2_;
  auVar95._0_2_ = local_318._0_2_;
  auVar95._2_2_ = local_268._0_2_;
  auVar5._2_2_ = local_268._8_2_;
  auVar5._0_2_ = local_318._8_2_;
  auVar5._4_2_ = local_318._10_2_;
  auVar5._6_2_ = local_268._10_2_;
  auVar5._8_2_ = local_318._12_2_;
  auVar5._10_2_ = local_268._12_2_;
  auVar5._12_2_ = local_318._14_2_;
  auVar5._14_2_ = local_268._14_2_;
  auVar164._8_4_ = 0xf04ffce1;
  auVar164._0_8_ = 0xf04ffce1f04ffce1;
  auVar164._12_4_ = 0xf04ffce1;
  auVar84 = pmaddwd(auVar95,auVar164);
  auVar83 = pmaddwd(auVar5,auVar164);
  auVar198._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar198._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar198._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar198._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar389._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar389._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar389._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar389._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar188 = packssdw(auVar198,auVar389);
  auVar84 = pmaddwd(auVar95,auVar123);
  auVar83 = pmaddwd(auVar5,auVar123);
  auVar99._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar99._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar99._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar99._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar6._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar6._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar6._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar6._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar242 = packssdw(auVar99,auVar6);
  auVar202._0_12_ = local_2e8._0_12_;
  auVar202._12_2_ = local_2e8._6_2_;
  auVar202._14_2_ = local_298._6_2_;
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._0_10_ = local_2e8._0_10_;
  auVar201._10_2_ = local_298._4_2_;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._0_8_ = local_2e8._0_8_;
  auVar200._8_2_ = local_2e8._4_2_;
  auVar199._8_8_ = auVar200._8_8_;
  auVar199._6_2_ = local_298._2_2_;
  auVar199._4_2_ = local_2e8._2_2_;
  auVar199._0_2_ = local_2e8._0_2_;
  auVar199._2_2_ = local_298._0_2_;
  auVar7._2_2_ = local_298._8_2_;
  auVar7._0_2_ = local_2e8._8_2_;
  auVar7._4_2_ = local_2e8._10_2_;
  auVar7._6_2_ = local_298._10_2_;
  auVar7._8_2_ = local_2e8._12_2_;
  auVar7._10_2_ = local_298._12_2_;
  auVar7._12_2_ = local_2e8._14_2_;
  auVar7._14_2_ = local_298._14_2_;
  auVar124._8_4_ = 0xd4ef71c;
  auVar124._0_8_ = 0xd4ef71c0d4ef71c;
  auVar124._12_4_ = 0xd4ef71c;
  auVar84 = pmaddwd(auVar199,auVar124);
  auVar83 = pmaddwd(auVar7,auVar124);
  auVar373._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar373._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar373._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar373._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar100._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar100._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar100._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar100._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar331 = packssdw(auVar373,auVar100);
  auVar356._8_4_ = 0x8e40d4e;
  auVar356._0_8_ = 0x8e40d4e08e40d4e;
  auVar356._12_4_ = 0x8e40d4e;
  auVar84 = pmaddwd(auVar199,auVar356);
  auVar83 = pmaddwd(auVar7,auVar356);
  auVar203._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar203._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar203._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar203._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar8._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar192 = packssdw(auVar203,auVar8);
  auVar393._0_12_ = local_2d8._0_12_;
  auVar393._12_2_ = local_2d8._6_2_;
  auVar393._14_2_ = local_2a8._6_2_;
  auVar392._12_4_ = auVar393._12_4_;
  auVar392._0_10_ = local_2d8._0_10_;
  auVar392._10_2_ = local_2a8._4_2_;
  auVar391._10_6_ = auVar392._10_6_;
  auVar391._0_8_ = local_2d8._0_8_;
  auVar391._8_2_ = local_2d8._4_2_;
  auVar390._8_8_ = auVar391._8_8_;
  auVar390._6_2_ = local_2a8._2_2_;
  auVar390._4_2_ = local_2d8._2_2_;
  auVar390._0_2_ = local_2d8._0_2_;
  auVar390._2_2_ = local_2a8._0_2_;
  auVar9._2_2_ = local_2a8._8_2_;
  auVar9._0_2_ = local_2d8._8_2_;
  auVar9._4_2_ = local_2d8._10_2_;
  auVar9._6_2_ = local_2a8._10_2_;
  auVar9._8_2_ = local_2d8._12_2_;
  auVar9._10_2_ = local_2a8._12_2_;
  auVar9._12_2_ = local_2d8._14_2_;
  auVar9._14_2_ = local_2a8._14_2_;
  auVar258._8_4_ = 0xf71cf2b2;
  auVar258._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar258._12_4_ = 0xf71cf2b2;
  auVar84 = pmaddwd(auVar390,auVar258);
  auVar83 = pmaddwd(auVar9,auVar258);
  auVar165._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar165._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar165._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar165._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar101._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar101._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar101._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar101._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar190 = packssdw(auVar165,auVar101);
  auVar84 = pmaddwd(auVar390,auVar124);
  auVar83 = pmaddwd(auVar9,auVar124);
  auVar394._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar394._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar394._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar394._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar10._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar3 = packssdw(auVar394,auVar10);
  auVar84 = paddsw(local_238,local_208);
  auVar255 = psubsw(local_238,local_208);
  auVar85 = paddsw(local_228,local_218);
  auVar294 = psubsw(local_228,local_218);
  auVar307 = psubsw(local_1c8,local_1f8);
  auVar86 = paddsw(local_1c8,local_1f8);
  auVar257 = psubsw(local_1d8,local_1e8);
  auVar87 = paddsw(local_1d8,local_1e8);
  auVar88 = paddsw(local_1b8,local_188);
  auVar387 = psubsw(local_1b8,local_188);
  auVar13 = paddsw(local_1a8,local_198);
  auVar292 = psubsw(local_1a8,local_198);
  auVar4 = psubsw(local_148,local_178);
  auVar388 = paddsw(local_148,local_178);
  auVar5 = psubsw(local_158,local_168);
  auVar389 = paddsw(local_158,local_168);
  auVar390 = paddsw(local_138,local_108);
  auVar6 = psubsw(local_138,local_108);
  auVar391 = paddsw(local_128,local_118);
  auVar7 = psubsw(local_128,local_118);
  auVar8 = psubsw(local_c8,local_f8);
  auVar392 = paddsw(local_c8,local_f8);
  auVar9 = psubsw(local_d8,local_e8);
  auVar393 = paddsw(local_d8,local_e8);
  auVar394 = paddsw(local_b8,local_88);
  auVar10 = psubsw(local_b8,local_88);
  auVar395 = paddsw(local_a8,local_98);
  auVar82 = psubsw(local_a8,local_98);
  auVar118 = psubsw(local_48,local_78);
  auVar396 = paddsw(local_48,local_78);
  auVar120 = psubsw(local_58,local_68);
  auVar397 = paddsw(local_58,local_68);
  auVar83 = pshuflw(ZEXT416(0x30f8),ZEXT416(0x30f8),0);
  uVar1 = auVar83._0_4_;
  auVar398._4_4_ = uVar1;
  auVar398._0_4_ = uVar1;
  auVar398._8_4_ = uVar1;
  auVar398._12_4_ = uVar1;
  auVar83 = pshuflw(ZEXT416(0x7640),ZEXT416(0x7640),0);
  uVar1 = auVar83._0_4_;
  auVar102._4_4_ = uVar1;
  auVar102._0_4_ = uVar1;
  auVar102._8_4_ = uVar1;
  auVar102._12_4_ = uVar1;
  auVar83._8_8_ = lStack_410;
  auVar83._0_8_ = local_418;
  auVar155 = pmulhrsw(auVar398,auVar83);
  auVar244 = pmulhrsw(auVar102,auVar83);
  auVar398 = paddsw(auVar12,auVar122);
  auVar83 = psubsw(auVar12,auVar122);
  auVar157 = psubsw(auVar11,auVar251);
  auVar122 = paddsw(auVar251,auVar11);
  local_758 = auVar2._0_2_;
  uStack_756 = auVar2._2_2_;
  uStack_754 = auVar2._4_2_;
  uStack_752 = auVar2._6_2_;
  uStack_750 = auVar2._8_2_;
  uStack_74e = auVar2._10_2_;
  uStack_74c = auVar2._12_2_;
  uStack_74a = auVar2._14_2_;
  auVar402._0_12_ = auVar253._0_12_;
  auVar402._12_2_ = auVar253._6_2_;
  auVar402._14_2_ = uStack_752;
  auVar401._12_4_ = auVar402._12_4_;
  auVar401._0_10_ = auVar253._0_10_;
  auVar401._10_2_ = uStack_754;
  auVar400._10_6_ = auVar401._10_6_;
  auVar400._0_8_ = auVar253._0_8_;
  auVar400._8_2_ = auVar253._4_2_;
  auVar399._8_8_ = auVar400._8_8_;
  auVar399._6_2_ = uStack_756;
  auVar399._4_2_ = auVar253._2_2_;
  auVar399._0_2_ = auVar253._0_2_;
  auVar399._2_2_ = local_758;
  auVar245._2_2_ = uStack_750;
  auVar245._0_2_ = auVar253._8_2_;
  auVar245._4_2_ = auVar253._10_2_;
  auVar245._6_2_ = uStack_74e;
  auVar245._8_2_ = auVar253._12_2_;
  auVar245._10_2_ = uStack_74c;
  auVar245._12_2_ = auVar253._14_2_;
  auVar245._14_2_ = uStack_74a;
  auVar103._8_4_ = 0x61ff138;
  auVar103._0_8_ = 0x61ff138061ff138;
  auVar103._12_4_ = 0x61ff138;
  auVar2 = pmaddwd(auVar399,auVar103);
  auVar251 = pmaddwd(auVar245,auVar103);
  auVar416._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar416._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar416._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar416._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar11._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar11 = packssdw(auVar416,auVar11);
  auVar12._8_4_ = 0xec8061f;
  auVar12._0_8_ = 0xec8061f0ec8061f;
  auVar12._12_4_ = 0xec8061f;
  auVar2 = pmaddwd(auVar399,auVar12);
  auVar251 = pmaddwd(auVar245,auVar12);
  auVar403._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar403._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar403._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar403._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar246._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar246._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar246._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar246._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar404 = packssdw(auVar403,auVar246);
  local_868 = auVar72._0_2_;
  uStack_866 = auVar72._2_2_;
  uStack_864 = auVar72._4_2_;
  uStack_862 = auVar72._6_2_;
  uStack_860 = auVar72._8_2_;
  uStack_85e = auVar72._10_2_;
  uStack_85c = auVar72._12_2_;
  uStack_85a = auVar72._14_2_;
  auVar408._0_12_ = auVar351._0_12_;
  auVar408._12_2_ = auVar351._6_2_;
  auVar408._14_2_ = uStack_862;
  auVar407._12_4_ = auVar408._12_4_;
  auVar407._0_10_ = auVar351._0_10_;
  auVar407._10_2_ = uStack_864;
  auVar406._10_6_ = auVar407._10_6_;
  auVar406._0_8_ = auVar351._0_8_;
  auVar406._8_2_ = auVar351._4_2_;
  auVar405._8_8_ = auVar406._8_8_;
  auVar405._6_2_ = uStack_866;
  auVar405._4_2_ = auVar351._2_2_;
  auVar405._0_2_ = auVar351._0_2_;
  auVar405._2_2_ = local_868;
  auVar438._2_2_ = uStack_860;
  auVar438._0_2_ = auVar351._8_2_;
  auVar438._4_2_ = auVar351._10_2_;
  auVar438._6_2_ = uStack_85e;
  auVar438._8_2_ = auVar351._12_2_;
  auVar438._10_2_ = uStack_85c;
  auVar438._12_2_ = auVar351._14_2_;
  auVar438._14_2_ = uStack_85a;
  auVar247._8_4_ = 0xf138f9e1;
  auVar247._0_8_ = 0xf138f9e1f138f9e1;
  auVar247._12_4_ = 0xf138f9e1;
  auVar2 = pmaddwd(auVar405,auVar247);
  auVar251 = pmaddwd(auVar438,auVar247);
  auVar443._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar443._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar443._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar443._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar72._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar72._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar72._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar72._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar72 = packssdw(auVar443,auVar72);
  auVar251 = pmaddwd(auVar405,auVar103);
  auVar2 = pmaddwd(auVar438,auVar103);
  auVar409._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar409._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar409._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar409._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar439._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar439._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar439._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar439._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar410 = packssdw(auVar409,auVar439);
  auVar248 = paddsw(local_338,local_308);
  auVar2 = psubsw(local_338,local_308);
  auVar249 = paddsw(auVar159,auVar188);
  auVar440 = psubsw(auVar159,auVar188);
  auVar159 = psubsw(local_2c8,local_2f8);
  auVar250 = paddsw(local_2c8,local_2f8);
  auVar188 = psubsw(auVar190,auVar331);
  auVar166 = paddsw(auVar190,auVar331);
  auVar167 = paddsw(local_2b8,local_288);
  auVar190 = psubsw(local_2b8,local_288);
  auVar168 = paddsw(auVar3,auVar192);
  auVar3 = psubsw(auVar3,auVar192);
  auVar192 = psubsw(local_248,local_278);
  auVar169 = paddsw(local_248,local_278);
  auVar441 = psubsw(auVar240,auVar242);
  auVar170 = paddsw(auVar242,auVar240);
  local_5a8 = auVar120._0_2_;
  uStack_5a6 = auVar120._2_2_;
  uStack_5a4 = auVar120._4_2_;
  uStack_5a2 = auVar120._6_2_;
  uStack_5a0 = auVar120._8_2_;
  uStack_59e = auVar120._10_2_;
  uStack_59c = auVar120._12_2_;
  uStack_59a = auVar120._14_2_;
  auVar17._0_12_ = auVar294._0_12_;
  auVar17._12_2_ = auVar294._6_2_;
  auVar17._14_2_ = uStack_5a2;
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_10_ = auVar294._0_10_;
  auVar16._10_2_ = uStack_5a4;
  auVar15._10_6_ = auVar16._10_6_;
  auVar15._0_8_ = auVar294._0_8_;
  auVar15._8_2_ = auVar294._4_2_;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._6_2_ = uStack_5a6;
  auVar14._4_2_ = auVar294._2_2_;
  auVar14._0_2_ = auVar294._0_2_;
  auVar14._2_2_ = local_5a8;
  auVar332._2_2_ = uStack_5a0;
  auVar332._0_2_ = auVar294._8_2_;
  auVar332._4_2_ = auVar294._10_2_;
  auVar332._6_2_ = uStack_59e;
  auVar332._8_2_ = auVar294._12_2_;
  auVar332._10_2_ = uStack_59c;
  auVar332._12_2_ = auVar294._14_2_;
  auVar332._14_2_ = uStack_59a;
  auVar251 = pmaddwd(auVar14,auVar123);
  auVar120 = pmaddwd(auVar332,auVar123);
  auVar171._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar204._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar204._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar204._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar204._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar351 = packssdw(auVar171,auVar204);
  auVar251 = pmaddwd(auVar14,auVar339);
  auVar120 = pmaddwd(auVar332,auVar339);
  auVar18._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar333._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar333._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar333._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar333._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar240 = packssdw(auVar18,auVar333);
  local_5b8 = auVar118._0_2_;
  uStack_5b6 = auVar118._2_2_;
  uStack_5b4 = auVar118._4_2_;
  uStack_5b2 = auVar118._6_2_;
  uStack_5b0 = auVar118._8_2_;
  uStack_5ae = auVar118._10_2_;
  uStack_5ac = auVar118._12_2_;
  uStack_5aa = auVar118._14_2_;
  auVar22._0_12_ = auVar255._0_12_;
  auVar22._12_2_ = auVar255._6_2_;
  auVar22._14_2_ = uStack_5b2;
  auVar21._12_4_ = auVar22._12_4_;
  auVar21._0_10_ = auVar255._0_10_;
  auVar21._10_2_ = uStack_5b4;
  auVar20._10_6_ = auVar21._10_6_;
  auVar20._0_8_ = auVar255._0_8_;
  auVar20._8_2_ = auVar255._4_2_;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._6_2_ = uStack_5b6;
  auVar19._4_2_ = auVar255._2_2_;
  auVar19._0_2_ = auVar255._0_2_;
  auVar19._2_2_ = local_5b8;
  auVar295._2_2_ = uStack_5b0;
  auVar295._0_2_ = auVar255._8_2_;
  auVar295._4_2_ = auVar255._10_2_;
  auVar295._6_2_ = uStack_5ae;
  auVar295._8_2_ = auVar255._12_2_;
  auVar295._10_2_ = uStack_5ac;
  auVar295._12_2_ = auVar255._14_2_;
  auVar295._14_2_ = uStack_5aa;
  auVar251 = pmaddwd(auVar19,auVar339);
  auVar242 = pmaddwd(auVar295,auVar339);
  auVar118 = pmaddwd(auVar19,auVar123);
  auVar120 = pmaddwd(auVar295,auVar123);
  auVar104._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar104._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar104._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar104._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar205._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar205._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar205._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar205._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar253 = packssdw(auVar104,auVar205);
  auVar23._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar296._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar296._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar296._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar296._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar242 = packssdw(auVar23,auVar296);
  local_5d8 = auVar10._0_2_;
  uStack_5d6 = auVar10._2_2_;
  uStack_5d4 = auVar10._4_2_;
  uStack_5d2 = auVar10._6_2_;
  uStack_5d0 = auVar10._8_2_;
  uStack_5ce = auVar10._10_2_;
  uStack_5cc = auVar10._12_2_;
  uStack_5ca = auVar10._14_2_;
  auVar209._0_12_ = auVar307._0_12_;
  auVar209._12_2_ = auVar307._6_2_;
  auVar209._14_2_ = uStack_5d2;
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._0_10_ = auVar307._0_10_;
  auVar208._10_2_ = uStack_5d4;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._0_8_ = auVar307._0_8_;
  auVar207._8_2_ = auVar307._4_2_;
  auVar206._8_8_ = auVar207._8_8_;
  auVar206._6_2_ = uStack_5d6;
  auVar206._4_2_ = auVar307._2_2_;
  auVar206._0_2_ = auVar307._0_2_;
  auVar206._2_2_ = local_5d8;
  auVar352._2_2_ = uStack_5d0;
  auVar352._0_2_ = auVar307._8_2_;
  auVar352._4_2_ = auVar307._10_2_;
  auVar352._6_2_ = uStack_5ce;
  auVar352._8_2_ = auVar307._12_2_;
  auVar352._10_2_ = uStack_5cc;
  auVar352._12_2_ = auVar307._14_2_;
  auVar352._14_2_ = uStack_5ca;
  auVar10 = pmaddwd(auVar206,auVar164);
  auVar251 = pmaddwd(auVar352,auVar164);
  auVar105._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar105._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar105._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar105._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar24._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar24._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar24._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar24._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar255 = packssdw(auVar105,auVar24);
  auVar251 = pmaddwd(auVar206,auVar123);
  auVar10 = pmaddwd(auVar352,auVar123);
  auVar210._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar210._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar210._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar210._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar353._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar353._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar353._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar353._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar437 = packssdw(auVar210,auVar353);
  local_4d8 = auVar82._0_2_;
  uStack_4d6 = auVar82._2_2_;
  uStack_4d4 = auVar82._4_2_;
  uStack_4d2 = auVar82._6_2_;
  uStack_4d0 = auVar82._8_2_;
  uStack_4ce = auVar82._10_2_;
  uStack_4cc = auVar82._12_2_;
  uStack_4ca = auVar82._14_2_;
  auVar28._0_12_ = auVar257._0_12_;
  auVar28._12_2_ = auVar257._6_2_;
  auVar28._14_2_ = uStack_4d2;
  auVar27._12_4_ = auVar28._12_4_;
  auVar27._0_10_ = auVar257._0_10_;
  auVar27._10_2_ = uStack_4d4;
  auVar26._10_6_ = auVar27._10_6_;
  auVar26._0_8_ = auVar257._0_8_;
  auVar26._8_2_ = auVar257._4_2_;
  auVar25._8_8_ = auVar26._8_8_;
  auVar25._6_2_ = uStack_4d6;
  auVar25._4_2_ = auVar257._2_2_;
  auVar25._0_2_ = auVar257._0_2_;
  auVar25._2_2_ = local_4d8;
  auVar125._2_2_ = uStack_4d0;
  auVar125._0_2_ = auVar257._8_2_;
  auVar125._4_2_ = auVar257._10_2_;
  auVar125._6_2_ = uStack_4ce;
  auVar125._8_2_ = auVar257._12_2_;
  auVar125._10_2_ = uStack_4cc;
  auVar125._12_2_ = auVar257._14_2_;
  auVar125._14_2_ = uStack_4ca;
  auVar10 = pmaddwd(auVar25,auVar164);
  auVar118 = pmaddwd(auVar164,auVar125);
  auVar251 = pmaddwd(auVar25,auVar123);
  auVar82 = pmaddwd(auVar125,auVar123);
  auVar106._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar106._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar106._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar106._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar308._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar308._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar308._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar308._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar257 = packssdw(auVar106,auVar308);
  auVar29._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar126._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar126._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar126._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar126._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar10 = packssdw(auVar29,auVar126);
  local_4c8 = auVar9._0_2_;
  uStack_4c6 = auVar9._2_2_;
  uStack_4c4 = auVar9._4_2_;
  uStack_4c2 = auVar9._6_2_;
  uStack_4c0 = auVar9._8_2_;
  uStack_4be = auVar9._10_2_;
  uStack_4bc = auVar9._12_2_;
  uStack_4ba = auVar9._14_2_;
  auVar175._0_12_ = auVar292._0_12_;
  auVar175._12_2_ = auVar292._6_2_;
  auVar175._14_2_ = uStack_4c2;
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._0_10_ = auVar292._0_10_;
  auVar174._10_2_ = uStack_4c4;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._0_8_ = auVar292._0_8_;
  auVar173._8_2_ = auVar292._4_2_;
  auVar172._8_8_ = auVar173._8_8_;
  auVar172._6_2_ = uStack_4c6;
  auVar172._4_2_ = auVar292._2_2_;
  auVar172._0_2_ = auVar292._0_2_;
  auVar172._2_2_ = local_4c8;
  auVar259._2_2_ = uStack_4c0;
  auVar259._0_2_ = auVar292._8_2_;
  auVar259._4_2_ = auVar292._10_2_;
  auVar259._6_2_ = uStack_4be;
  auVar259._8_2_ = auVar292._12_2_;
  auVar259._10_2_ = uStack_4bc;
  auVar259._12_2_ = auVar292._14_2_;
  auVar259._14_2_ = uStack_4ba;
  auVar9 = pmaddwd(auVar172,auVar124);
  auVar251 = pmaddwd(auVar259,auVar124);
  auVar107._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar107._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar107._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar107._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar30._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar9 = packssdw(auVar107,auVar30);
  auVar251 = pmaddwd(auVar172,auVar356);
  auVar82 = pmaddwd(auVar259,auVar356);
  auVar176._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar176._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar176._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar176._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar260._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar260._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar260._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar260._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar372 = packssdw(auVar176,auVar260);
  local_5f8 = auVar8._0_2_;
  uStack_5f6 = auVar8._2_2_;
  uStack_5f4 = auVar8._4_2_;
  uStack_5f2 = auVar8._6_2_;
  uStack_5f0 = auVar8._8_2_;
  uStack_5ee = auVar8._10_2_;
  uStack_5ec = auVar8._12_2_;
  uStack_5ea = auVar8._14_2_;
  auVar111._0_12_ = auVar387._0_12_;
  auVar111._12_2_ = auVar387._6_2_;
  auVar111._14_2_ = uStack_5f2;
  auVar110._12_4_ = auVar111._12_4_;
  auVar110._0_10_ = auVar387._0_10_;
  auVar110._10_2_ = uStack_5f4;
  auVar109._10_6_ = auVar110._10_6_;
  auVar109._0_8_ = auVar387._0_8_;
  auVar109._8_2_ = auVar387._4_2_;
  auVar108._8_8_ = auVar109._8_8_;
  auVar108._6_2_ = uStack_5f6;
  auVar108._4_2_ = auVar387._2_2_;
  auVar108._0_2_ = auVar387._0_2_;
  auVar108._2_2_ = local_5f8;
  auVar423._2_2_ = uStack_5f0;
  auVar423._0_2_ = auVar387._8_2_;
  auVar423._4_2_ = auVar387._10_2_;
  auVar423._6_2_ = uStack_5ee;
  auVar423._8_2_ = auVar387._12_2_;
  auVar423._10_2_ = uStack_5ec;
  auVar423._12_2_ = auVar387._14_2_;
  auVar423._14_2_ = uStack_5ea;
  auVar8 = pmaddwd(auVar108,auVar356);
  auVar118 = pmaddwd(auVar423,auVar356);
  auVar82 = pmaddwd(auVar108,auVar124);
  auVar251 = pmaddwd(auVar423,auVar124);
  auVar211._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar211._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar211._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar211._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar31._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar31._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar31._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar31._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar387 = packssdw(auVar211,auVar31);
  auVar112._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar112._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar112._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar112._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  auVar424._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar424._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar424._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar424._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar292 = packssdw(auVar112,auVar424);
  local_7a8 = auVar6._0_2_;
  uStack_7a6 = auVar6._2_2_;
  uStack_7a4 = auVar6._4_2_;
  uStack_7a2 = auVar6._6_2_;
  uStack_7a0 = auVar6._8_2_;
  uStack_79e = auVar6._10_2_;
  uStack_79c = auVar6._12_2_;
  uStack_79a = auVar6._14_2_;
  auVar215._0_12_ = auVar4._0_12_;
  auVar215._12_2_ = auVar4._6_2_;
  auVar215._14_2_ = uStack_7a2;
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._0_10_ = auVar4._0_10_;
  auVar214._10_2_ = uStack_7a4;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._0_8_ = auVar4._0_8_;
  auVar213._8_2_ = auVar4._4_2_;
  auVar212._8_8_ = auVar213._8_8_;
  auVar212._6_2_ = uStack_7a6;
  auVar212._4_2_ = auVar4._2_2_;
  auVar212._0_2_ = auVar4._0_2_;
  auVar212._2_2_ = local_7a8;
  auVar309._2_2_ = uStack_7a0;
  auVar309._0_2_ = auVar4._8_2_;
  auVar309._4_2_ = auVar4._10_2_;
  auVar309._6_2_ = uStack_79e;
  auVar309._8_2_ = auVar4._12_2_;
  auVar309._10_2_ = uStack_79c;
  auVar309._12_2_ = auVar4._14_2_;
  auVar309._14_2_ = uStack_79a;
  auVar4 = pmaddwd(auVar212,auVar258);
  auVar251 = pmaddwd(auVar309,auVar258);
  auVar127._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar127._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar127._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar127._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar32._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar294 = packssdw(auVar127,auVar32);
  auVar251 = pmaddwd(auVar212,auVar124);
  auVar4 = pmaddwd(auVar309,auVar124);
  auVar216._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar216._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar216._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar216._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar310._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar310._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar310._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar310._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar422 = packssdw(auVar216,auVar310);
  local_4e8 = auVar7._0_2_;
  uStack_4e6 = auVar7._2_2_;
  uStack_4e4 = auVar7._4_2_;
  uStack_4e2 = auVar7._6_2_;
  uStack_4e0 = auVar7._8_2_;
  uStack_4de = auVar7._10_2_;
  uStack_4dc = auVar7._12_2_;
  uStack_4da = auVar7._14_2_;
  auVar36._0_12_ = auVar5._0_12_;
  auVar36._12_2_ = auVar5._6_2_;
  auVar36._14_2_ = uStack_4e2;
  auVar35._12_4_ = auVar36._12_4_;
  auVar35._0_10_ = auVar5._0_10_;
  auVar35._10_2_ = uStack_4e4;
  auVar34._10_6_ = auVar35._10_6_;
  auVar34._0_8_ = auVar5._0_8_;
  auVar34._8_2_ = auVar5._4_2_;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._6_2_ = uStack_4e6;
  auVar33._4_2_ = auVar5._2_2_;
  auVar33._0_2_ = auVar5._0_2_;
  auVar33._2_2_ = local_4e8;
  auVar217._2_2_ = uStack_4e0;
  auVar217._0_2_ = auVar5._8_2_;
  auVar217._4_2_ = auVar5._10_2_;
  auVar217._6_2_ = uStack_4de;
  auVar217._8_2_ = auVar5._12_2_;
  auVar217._10_2_ = uStack_4dc;
  auVar217._12_2_ = auVar5._14_2_;
  auVar217._14_2_ = uStack_4da;
  auVar6 = pmaddwd(auVar33,auVar258);
  auVar5 = pmaddwd(auVar258,auVar217);
  auVar251 = pmaddwd(auVar33,auVar124);
  auVar4 = pmaddwd(auVar217,auVar124);
  auVar354._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar354._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar354._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar354._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar261._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar261._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar261._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar261._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar355 = packssdw(auVar354,auVar261);
  auVar37._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar37._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar37._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar37._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar218._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar218._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar218._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar218._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4 = packssdw(auVar37,auVar218);
  auVar251 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar38._0_4_ = auVar251._0_4_;
  auVar38._4_4_ = auVar38._0_4_;
  auVar38._8_4_ = auVar38._0_4_;
  auVar38._12_4_ = auVar38._0_4_;
  auVar251._8_8_ = lStack_430;
  auVar251._0_8_ = local_438;
  auVar251 = pmulhrsw(auVar38,auVar251);
  auVar219 = paddsw(auVar251,auVar244);
  auVar220 = psubsw(auVar251,auVar244);
  auVar221 = paddsw(auVar251,auVar155);
  auVar5 = psubsw(auVar251,auVar155);
  local_608 = auVar157._0_2_;
  uStack_606 = auVar157._2_2_;
  uStack_604 = auVar157._4_2_;
  uStack_602 = auVar157._6_2_;
  uStack_600 = auVar157._8_2_;
  uStack_5fe = auVar157._10_2_;
  uStack_5fc = auVar157._12_2_;
  uStack_5fa = auVar157._14_2_;
  auVar265._0_12_ = auVar83._0_12_;
  auVar265._12_2_ = auVar83._6_2_;
  auVar265._14_2_ = uStack_602;
  auVar264._12_4_ = auVar265._12_4_;
  auVar264._0_10_ = auVar83._0_10_;
  auVar264._10_2_ = uStack_604;
  auVar263._10_6_ = auVar264._10_6_;
  auVar263._0_8_ = auVar83._0_8_;
  auVar263._8_2_ = auVar83._4_2_;
  auVar262._8_8_ = auVar263._8_8_;
  auVar262._6_2_ = uStack_606;
  auVar262._4_2_ = auVar83._2_2_;
  auVar262._0_2_ = auVar83._0_2_;
  auVar262._2_2_ = local_608;
  auVar297._2_2_ = uStack_600;
  auVar297._0_2_ = auVar83._8_2_;
  auVar297._4_2_ = auVar83._10_2_;
  auVar297._6_2_ = uStack_5fe;
  auVar297._8_2_ = auVar83._12_2_;
  auVar297._10_2_ = uStack_5fc;
  auVar297._12_2_ = auVar83._14_2_;
  auVar297._14_2_ = uStack_5fa;
  auVar311._8_4_ = 0xb50f4b0;
  auVar311._0_8_ = 0xb50f4b00b50f4b0;
  auVar311._12_4_ = 0xb50f4b0;
  auVar83 = pmaddwd(auVar262,auVar311);
  auVar251 = pmaddwd(auVar297,auVar311);
  auVar222._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar222._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar222._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar222._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar128._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar128._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar128._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar128._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar157 = packssdw(auVar222,auVar128);
  auVar129._8_4_ = 0xb500b50;
  auVar129._0_8_ = 0xb500b500b500b50;
  auVar129._12_4_ = 0xb500b50;
  auVar83 = pmaddwd(auVar262,auVar129);
  auVar251 = pmaddwd(auVar297,auVar129);
  auVar266._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar266._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar266._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar266._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar39._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar39._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar39._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar39._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar267 = packssdw(auVar266,auVar39);
  auVar130 = paddsw(auVar74,auVar76);
  auVar7 = psubsw(auVar74,auVar76);
  auVar131 = paddsw(auVar11,auVar72);
  auVar6 = psubsw(auVar11,auVar72);
  auVar298 = psubsw(auVar80,auVar78);
  auVar72 = paddsw(auVar80,auVar78);
  auVar299 = psubsw(auVar404,auVar410);
  auVar331 = paddsw(auVar410,auVar404);
  auVar377._0_12_ = auVar440._0_12_;
  auVar377._12_2_ = auVar440._6_2_;
  auVar377._14_2_ = auVar441._6_2_;
  auVar376._12_4_ = auVar377._12_4_;
  auVar376._0_10_ = auVar440._0_10_;
  auVar376._10_2_ = auVar441._4_2_;
  auVar375._10_6_ = auVar376._10_6_;
  auVar375._0_8_ = auVar440._0_8_;
  auVar375._8_2_ = auVar440._4_2_;
  auVar374._8_8_ = auVar375._8_8_;
  auVar374._6_2_ = auVar441._2_2_;
  auVar374._4_2_ = auVar440._2_2_;
  auVar374._0_2_ = auVar440._0_2_;
  auVar374._2_2_ = auVar441._0_2_;
  auVar40._2_2_ = auVar441._8_2_;
  auVar40._0_2_ = auVar440._8_2_;
  auVar40._4_2_ = auVar440._10_2_;
  auVar40._6_2_ = auVar441._10_2_;
  auVar40._8_2_ = auVar440._12_2_;
  auVar40._10_2_ = auVar441._12_2_;
  auVar40._12_2_ = auVar440._14_2_;
  auVar40._14_2_ = auVar441._14_2_;
  auVar83 = pmaddwd(auVar374,auVar103);
  auVar251 = pmaddwd(auVar40,auVar103);
  auVar312._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar312._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar312._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar312._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar132._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar132._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar132._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar132._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar441 = packssdw(auVar312,auVar132);
  auVar83 = pmaddwd(auVar374,auVar12);
  auVar251 = pmaddwd(auVar40,auVar12);
  auVar378._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar378._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar378._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar378._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar300._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar300._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar300._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar300._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar379 = packssdw(auVar378,auVar300);
  local_498 = auVar192._0_2_;
  uStack_496 = auVar192._2_2_;
  uStack_494 = auVar192._4_2_;
  uStack_492 = auVar192._6_2_;
  uStack_490 = auVar192._8_2_;
  uStack_48e = auVar192._10_2_;
  uStack_48c = auVar192._12_2_;
  uStack_48a = auVar192._14_2_;
  auVar414._0_12_ = auVar2._0_12_;
  auVar414._12_2_ = auVar2._6_2_;
  auVar414._14_2_ = uStack_492;
  auVar413._12_4_ = auVar414._12_4_;
  auVar413._0_10_ = auVar2._0_10_;
  auVar413._10_2_ = uStack_494;
  auVar412._10_6_ = auVar413._10_6_;
  auVar412._0_8_ = auVar2._0_8_;
  auVar412._8_2_ = auVar2._4_2_;
  auVar411._8_8_ = auVar412._8_8_;
  auVar411._6_2_ = uStack_496;
  auVar411._4_2_ = auVar2._2_2_;
  auVar411._0_2_ = auVar2._0_2_;
  auVar411._2_2_ = local_498;
  auVar74._2_2_ = uStack_490;
  auVar74._0_2_ = auVar2._8_2_;
  auVar74._4_2_ = auVar2._10_2_;
  auVar74._6_2_ = uStack_48e;
  auVar74._8_2_ = auVar2._12_2_;
  auVar74._10_2_ = uStack_48c;
  auVar74._12_2_ = auVar2._14_2_;
  auVar74._14_2_ = uStack_48a;
  auVar251 = pmaddwd(auVar411,auVar103);
  auVar83 = pmaddwd(auVar74,auVar103);
  auVar41._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar133._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar8 = packssdw(auVar41,auVar133);
  auVar83 = pmaddwd(auVar411,auVar12);
  auVar251 = pmaddwd(auVar74,auVar12);
  auVar415._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar415._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar415._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar415._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar76._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar76._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar76._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar76._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar416 = packssdw(auVar415,auVar76);
  local_488 = auVar190._0_2_;
  uStack_486 = auVar190._2_2_;
  uStack_484 = auVar190._4_2_;
  uStack_482 = auVar190._6_2_;
  uStack_480 = auVar190._8_2_;
  uStack_47e = auVar190._10_2_;
  uStack_47c = auVar190._12_2_;
  uStack_47a = auVar190._14_2_;
  auVar137._0_12_ = auVar159._0_12_;
  auVar137._12_2_ = auVar159._6_2_;
  auVar137._14_2_ = uStack_482;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar159._0_10_;
  auVar136._10_2_ = uStack_484;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = auVar159._0_8_;
  auVar135._8_2_ = auVar159._4_2_;
  auVar134._8_8_ = auVar135._8_8_;
  auVar134._6_2_ = uStack_486;
  auVar134._4_2_ = auVar159._2_2_;
  auVar134._0_2_ = auVar159._0_2_;
  auVar134._2_2_ = local_488;
  auVar301._2_2_ = uStack_480;
  auVar301._0_2_ = auVar159._8_2_;
  auVar301._4_2_ = auVar159._10_2_;
  auVar301._6_2_ = uStack_47e;
  auVar301._8_2_ = auVar159._12_2_;
  auVar301._10_2_ = uStack_47c;
  auVar301._12_2_ = auVar159._14_2_;
  auVar301._14_2_ = uStack_47a;
  auVar83 = pmaddwd(auVar134,auVar247);
  auVar251 = pmaddwd(auVar301,auVar247);
  auVar313._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar313._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar313._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar313._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar78._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar78._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar78._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar78._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar314 = packssdw(auVar313,auVar78);
  auVar251 = pmaddwd(auVar134,auVar103);
  auVar83 = pmaddwd(auVar301,auVar103);
  auVar138._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar138._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar138._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar138._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar302._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar302._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar302._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar302._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar307 = packssdw(auVar138,auVar302);
  local_848 = auVar3._0_2_;
  uStack_846 = auVar3._2_2_;
  uStack_844 = auVar3._4_2_;
  uStack_842 = auVar3._6_2_;
  uStack_840 = auVar3._8_2_;
  uStack_83e = auVar3._10_2_;
  uStack_83c = auVar3._12_2_;
  uStack_83a = auVar3._14_2_;
  auVar120._0_12_ = auVar188._0_12_;
  auVar120._12_2_ = auVar188._6_2_;
  auVar120._14_2_ = uStack_842;
  auVar118._12_4_ = auVar120._12_4_;
  auVar118._0_10_ = auVar188._0_10_;
  auVar118._10_2_ = uStack_844;
  auVar82._10_6_ = auVar118._10_6_;
  auVar82._0_8_ = auVar188._0_8_;
  auVar82._8_2_ = auVar188._4_2_;
  auVar80._8_8_ = auVar82._8_8_;
  auVar80._6_2_ = uStack_846;
  auVar80._4_2_ = auVar188._2_2_;
  auVar80._0_2_ = auVar188._0_2_;
  auVar80._2_2_ = local_848;
  auVar42._2_2_ = uStack_840;
  auVar42._0_2_ = auVar188._8_2_;
  auVar42._4_2_ = auVar188._10_2_;
  auVar42._6_2_ = uStack_83e;
  auVar42._8_2_ = auVar188._12_2_;
  auVar42._10_2_ = uStack_83c;
  auVar42._12_2_ = auVar188._14_2_;
  auVar42._14_2_ = uStack_83a;
  auVar83 = pmaddwd(auVar80,auVar247);
  auVar251 = pmaddwd(auVar42,auVar247);
  auVar303._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar303._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar303._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar303._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar139._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar139._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar139._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar139._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar440 = packssdw(auVar303,auVar139);
  auVar251 = pmaddwd(auVar80,auVar103);
  auVar83 = pmaddwd(auVar42,auVar103);
  auVar155._0_4_ = auVar251._0_4_ + 0x800 >> 0xc;
  auVar155._4_4_ = auVar251._4_4_ + 0x800 >> 0xc;
  auVar155._8_4_ = auVar251._8_4_ + 0x800 >> 0xc;
  auVar155._12_4_ = auVar251._12_4_ + 0x800 >> 0xc;
  auVar43._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar251 = packssdw(auVar155,auVar43);
  auVar74 = paddsw(auVar84,auVar86);
  auVar404 = psubsw(auVar84,auVar86);
  auVar83 = paddsw(auVar85,auVar87);
  auVar410 = psubsw(auVar85,auVar87);
  auVar76 = paddsw(auVar351,auVar257);
  auVar84 = psubsw(auVar351,auVar257);
  auVar85 = paddsw(auVar253,auVar255);
  auVar11 = psubsw(auVar253,auVar255);
  auVar253 = psubsw(auVar388,auVar88);
  auVar78 = paddsw(auVar388,auVar88);
  auVar255 = psubsw(auVar389,auVar13);
  auVar80 = paddsw(auVar389,auVar13);
  auVar86 = psubsw(auVar355,auVar9);
  auVar389 = paddsw(auVar355,auVar9);
  auVar82 = psubsw(auVar294,auVar387);
  auVar87 = paddsw(auVar294,auVar387);
  auVar356 = paddsw(auVar390,auVar392);
  auVar118 = psubsw(auVar390,auVar392);
  auVar390 = paddsw(auVar391,auVar393);
  auVar120 = psubsw(auVar391,auVar393);
  auVar88 = paddsw(auVar4,auVar372);
  auVar155 = psubsw(auVar4,auVar372);
  auVar391 = paddsw(auVar422,auVar292);
  auVar13 = psubsw(auVar422,auVar292);
  auVar244 = psubsw(auVar396,auVar394);
  auVar387 = paddsw(auVar396,auVar394);
  auVar192 = psubsw(auVar397,auVar395);
  auVar422 = paddsw(auVar397,auVar395);
  auVar190 = psubsw(auVar240,auVar10);
  auVar2 = paddsw(auVar10,auVar240);
  auVar188 = psubsw(auVar242,auVar437);
  auVar3 = paddsw(auVar437,auVar242);
  auVar351 = paddsw(auVar219,auVar122);
  auVar122 = psubsw(auVar219,auVar122);
  auVar372 = paddsw(auVar221,auVar267);
  auVar4 = psubsw(auVar221,auVar267);
  auVar437 = paddsw(auVar5,auVar157);
  auVar5 = psubsw(auVar5,auVar157);
  auVar221 = paddsw(auVar220,auVar398);
  auVar392 = psubsw(auVar220,auVar398);
  local_4d8 = auVar299._0_2_;
  uStack_4d6 = auVar299._2_2_;
  uStack_4d4 = auVar299._4_2_;
  uStack_4d2 = auVar299._6_2_;
  uStack_4d0 = auVar299._8_2_;
  uStack_4ce = auVar299._10_2_;
  uStack_4cc = auVar299._12_2_;
  uStack_4ca = auVar299._14_2_;
  auVar337._0_12_ = auVar6._0_12_;
  auVar337._12_2_ = auVar6._6_2_;
  auVar337._14_2_ = uStack_4d2;
  auVar336._12_4_ = auVar337._12_4_;
  auVar336._0_10_ = auVar6._0_10_;
  auVar336._10_2_ = uStack_4d4;
  auVar335._10_6_ = auVar336._10_6_;
  auVar335._0_8_ = auVar6._0_8_;
  auVar335._8_2_ = auVar6._4_2_;
  auVar334._8_8_ = auVar335._8_8_;
  auVar334._6_2_ = uStack_4d6;
  auVar334._4_2_ = auVar6._2_2_;
  auVar334._0_2_ = auVar6._0_2_;
  auVar334._2_2_ = local_4d8;
  auVar157._2_2_ = uStack_4d0;
  auVar157._0_2_ = auVar6._8_2_;
  auVar157._4_2_ = auVar6._10_2_;
  auVar157._6_2_ = uStack_4ce;
  auVar157._8_2_ = auVar6._12_2_;
  auVar157._10_2_ = uStack_4cc;
  auVar157._12_2_ = auVar6._14_2_;
  auVar157._14_2_ = uStack_4ca;
  auVar9 = pmaddwd(auVar334,auVar311);
  auVar6 = pmaddwd(auVar157,auVar311);
  auVar425._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar425._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar425._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar425._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar113._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar113._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar113._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar113._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar393 = packssdw(auVar425,auVar113);
  auVar9 = pmaddwd(auVar334,auVar129);
  auVar6 = pmaddwd(auVar157,auVar129);
  auVar338._0_4_ = auVar9._0_4_ + 0x800 >> 0xc;
  auVar338._4_4_ = auVar9._4_4_ + 0x800 >> 0xc;
  auVar338._8_4_ = auVar9._8_4_ + 0x800 >> 0xc;
  auVar338._12_4_ = auVar9._12_4_ + 0x800 >> 0xc;
  auVar159._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar159._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar159._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar159._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar339 = packssdw(auVar338,auVar159);
  local_4a8 = auVar298._0_2_;
  uStack_4a6 = auVar298._2_2_;
  uStack_4a4 = auVar298._4_2_;
  uStack_4a2 = auVar298._6_2_;
  uStack_4a0 = auVar298._8_2_;
  uStack_49e = auVar298._10_2_;
  uStack_49c = auVar298._12_2_;
  uStack_49a = auVar298._14_2_;
  auVar180._0_12_ = auVar7._0_12_;
  auVar180._12_2_ = auVar7._6_2_;
  auVar180._14_2_ = uStack_4a2;
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._0_10_ = auVar7._0_10_;
  auVar179._10_2_ = uStack_4a4;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._0_8_ = auVar7._0_8_;
  auVar178._8_2_ = auVar7._4_2_;
  auVar177._8_8_ = auVar178._8_8_;
  auVar177._6_2_ = uStack_4a6;
  auVar177._4_2_ = auVar7._2_2_;
  auVar177._0_2_ = auVar7._0_2_;
  auVar177._2_2_ = local_4a8;
  auVar223._2_2_ = uStack_4a0;
  auVar223._0_2_ = auVar7._8_2_;
  auVar223._4_2_ = auVar7._10_2_;
  auVar223._6_2_ = uStack_49e;
  auVar223._8_2_ = auVar7._12_2_;
  auVar223._10_2_ = uStack_49c;
  auVar223._12_2_ = auVar7._14_2_;
  auVar223._14_2_ = uStack_49a;
  auVar6 = pmaddwd(auVar177,auVar311);
  auVar7 = pmaddwd(auVar223,auVar311);
  auVar114._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar114._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar114._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar114._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar268._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar268._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar268._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar268._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar219 = packssdw(auVar114,auVar268);
  auVar6 = pmaddwd(auVar177,auVar129);
  auVar7 = pmaddwd(auVar223,auVar129);
  auVar181._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar181._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar181._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar181._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar224._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar224._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar224._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar224._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar220 = packssdw(auVar181,auVar224);
  auVar299 = paddsw(auVar248,auVar250);
  auVar157 = psubsw(auVar248,auVar250);
  auVar355 = paddsw(auVar249,auVar166);
  auVar159 = psubsw(auVar249,auVar166);
  auVar388 = paddsw(auVar441,auVar440);
  auVar6 = psubsw(auVar441,auVar440);
  auVar7 = paddsw(auVar8,auVar314);
  auVar440 = psubsw(auVar8,auVar314);
  auVar166 = psubsw(auVar169,auVar167);
  auVar8 = paddsw(auVar169,auVar167);
  auVar167 = psubsw(auVar170,auVar168);
  auVar9 = paddsw(auVar170,auVar168);
  auVar250 = psubsw(auVar379,auVar251);
  auVar251 = paddsw(auVar251,auVar379);
  auVar441 = psubsw(auVar416,auVar307);
  auVar10 = paddsw(auVar307,auVar416);
  local_548 = auVar188._0_2_;
  uStack_546 = auVar188._2_2_;
  uStack_544 = auVar188._4_2_;
  uStack_542 = auVar188._6_2_;
  uStack_540 = auVar188._8_2_;
  uStack_53e = auVar188._10_2_;
  uStack_53c = auVar188._12_2_;
  uStack_53a = auVar188._14_2_;
  auVar318._0_12_ = auVar11._0_12_;
  auVar318._12_2_ = auVar11._6_2_;
  auVar318._14_2_ = uStack_542;
  auVar317._12_4_ = auVar318._12_4_;
  auVar317._0_10_ = auVar11._0_10_;
  auVar317._10_2_ = uStack_544;
  auVar316._10_6_ = auVar317._10_6_;
  auVar316._0_8_ = auVar11._0_8_;
  auVar316._8_2_ = auVar11._4_2_;
  auVar315._8_8_ = auVar316._8_8_;
  auVar315._6_2_ = uStack_546;
  auVar315._4_2_ = auVar11._2_2_;
  auVar315._0_2_ = auVar11._0_2_;
  auVar315._2_2_ = local_548;
  auVar225._2_2_ = uStack_540;
  auVar225._0_2_ = auVar11._8_2_;
  auVar225._4_2_ = auVar11._10_2_;
  auVar225._6_2_ = uStack_53e;
  auVar225._8_2_ = auVar11._12_2_;
  auVar225._10_2_ = uStack_53c;
  auVar225._12_2_ = auVar11._14_2_;
  auVar225._14_2_ = uStack_53a;
  auVar188 = pmaddwd(auVar315,auVar103);
  auVar11 = pmaddwd(auVar225,auVar103);
  auVar395._0_4_ = auVar188._0_4_ + 0x800 >> 0xc;
  auVar395._4_4_ = auVar188._4_4_ + 0x800 >> 0xc;
  auVar395._8_4_ = auVar188._8_4_ + 0x800 >> 0xc;
  auVar395._12_4_ = auVar188._12_4_ + 0x800 >> 0xc;
  auVar188._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar188._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar188._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar188._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar188 = packssdw(auVar395,auVar188);
  auVar240 = pmaddwd(auVar315,auVar12);
  auVar11 = pmaddwd(auVar225,auVar12);
  auVar319._0_4_ = auVar240._0_4_ + 0x800 >> 0xc;
  auVar319._4_4_ = auVar240._4_4_ + 0x800 >> 0xc;
  auVar319._8_4_ = auVar240._8_4_ + 0x800 >> 0xc;
  auVar319._12_4_ = auVar240._12_4_ + 0x800 >> 0xc;
  auVar269._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar269._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar269._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar269._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar267 = packssdw(auVar319,auVar269);
  local_558 = auVar190._0_2_;
  uStack_556 = auVar190._2_2_;
  uStack_554 = auVar190._4_2_;
  uStack_552 = auVar190._6_2_;
  uStack_550 = auVar190._8_2_;
  uStack_54e = auVar190._10_2_;
  uStack_54c = auVar190._12_2_;
  uStack_54a = auVar190._14_2_;
  auVar273._0_12_ = auVar84._0_12_;
  auVar273._12_2_ = auVar84._6_2_;
  auVar273._14_2_ = uStack_552;
  auVar272._12_4_ = auVar273._12_4_;
  auVar272._0_10_ = auVar84._0_10_;
  auVar272._10_2_ = uStack_554;
  auVar271._10_6_ = auVar272._10_6_;
  auVar271._0_8_ = auVar84._0_8_;
  auVar271._8_2_ = auVar84._4_2_;
  auVar270._8_8_ = auVar271._8_8_;
  auVar270._6_2_ = uStack_556;
  auVar270._4_2_ = auVar84._2_2_;
  auVar270._0_2_ = auVar84._0_2_;
  auVar270._2_2_ = local_558;
  auVar396._2_2_ = uStack_550;
  auVar396._0_2_ = auVar84._8_2_;
  auVar396._4_2_ = auVar84._10_2_;
  auVar396._6_2_ = uStack_54e;
  auVar396._8_2_ = auVar84._12_2_;
  auVar396._10_2_ = uStack_54c;
  auVar396._12_2_ = auVar84._14_2_;
  auVar396._14_2_ = uStack_54a;
  auVar11 = pmaddwd(auVar270,auVar103);
  auVar84 = pmaddwd(auVar396,auVar103);
  auVar320._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar320._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar320._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar320._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar190._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar190._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar190._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar190._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar298 = packssdw(auVar320,auVar190);
  auVar11 = pmaddwd(auVar270,auVar12);
  auVar84 = pmaddwd(auVar396,auVar12);
  auVar274._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar274._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar274._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar274._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar397._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar397._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar397._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar397._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar168 = packssdw(auVar274,auVar397);
  local_5f8 = auVar192._0_2_;
  uStack_5f6 = auVar192._2_2_;
  uStack_5f4 = auVar192._4_2_;
  uStack_5f2 = auVar192._6_2_;
  uStack_5f0 = auVar192._8_2_;
  uStack_5ee = auVar192._10_2_;
  uStack_5ec = auVar192._12_2_;
  uStack_5ea = auVar192._14_2_;
  auVar278._0_12_ = auVar410._0_12_;
  auVar278._12_2_ = auVar410._6_2_;
  auVar278._14_2_ = uStack_5f2;
  auVar277._12_4_ = auVar278._12_4_;
  auVar277._0_10_ = auVar410._0_10_;
  auVar277._10_2_ = uStack_5f4;
  auVar276._10_6_ = auVar277._10_6_;
  auVar276._0_8_ = auVar410._0_8_;
  auVar276._8_2_ = auVar410._4_2_;
  auVar275._8_8_ = auVar276._8_8_;
  auVar275._6_2_ = uStack_5f6;
  auVar275._4_2_ = auVar410._2_2_;
  auVar275._0_2_ = auVar410._0_2_;
  auVar275._2_2_ = local_5f8;
  auVar44._2_2_ = uStack_5f0;
  auVar44._0_2_ = auVar410._8_2_;
  auVar44._4_2_ = auVar410._10_2_;
  auVar44._6_2_ = uStack_5ee;
  auVar44._8_2_ = auVar410._12_2_;
  auVar44._10_2_ = uStack_5ec;
  auVar44._12_2_ = auVar410._14_2_;
  auVar44._14_2_ = uStack_5ea;
  auVar11 = pmaddwd(auVar275,auVar103);
  auVar84 = pmaddwd(auVar44,auVar103);
  auVar321._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar321._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar321._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar321._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar192._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar192._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar192._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar192._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar314 = packssdw(auVar321,auVar192);
  auVar11 = pmaddwd(auVar275,auVar12);
  auVar84 = pmaddwd(auVar44,auVar12);
  auVar279._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar279._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar279._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar279._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar45._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar169 = packssdw(auVar279,auVar45);
  local_5e8 = auVar244._0_2_;
  uStack_5e6 = auVar244._2_2_;
  uStack_5e4 = auVar244._4_2_;
  uStack_5e2 = auVar244._6_2_;
  uStack_5e0 = auVar244._8_2_;
  uStack_5de = auVar244._10_2_;
  uStack_5dc = auVar244._12_2_;
  uStack_5da = auVar244._14_2_;
  auVar283._0_12_ = auVar404._0_12_;
  auVar283._12_2_ = auVar404._6_2_;
  auVar283._14_2_ = uStack_5e2;
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._0_10_ = auVar404._0_10_;
  auVar282._10_2_ = uStack_5e4;
  auVar281._10_6_ = auVar282._10_6_;
  auVar281._0_8_ = auVar404._0_8_;
  auVar281._8_2_ = auVar404._4_2_;
  auVar280._8_8_ = auVar281._8_8_;
  auVar280._6_2_ = uStack_5e6;
  auVar280._4_2_ = auVar404._2_2_;
  auVar280._0_2_ = auVar404._0_2_;
  auVar280._2_2_ = local_5e8;
  auVar46._2_2_ = uStack_5e0;
  auVar46._0_2_ = auVar404._8_2_;
  auVar46._4_2_ = auVar404._10_2_;
  auVar46._6_2_ = uStack_5de;
  auVar46._8_2_ = auVar404._12_2_;
  auVar46._10_2_ = uStack_5dc;
  auVar46._12_2_ = auVar404._14_2_;
  auVar46._14_2_ = uStack_5da;
  auVar190 = pmaddwd(auVar280,auVar12);
  auVar11 = pmaddwd(auVar46,auVar12);
  auVar12 = pmaddwd(auVar280,auVar103);
  auVar84 = pmaddwd(auVar46,auVar103);
  auVar322._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar322._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar322._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar322._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar240._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar240._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar240._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar240._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar379 = packssdw(auVar322,auVar240);
  auVar284._0_4_ = auVar190._0_4_ + 0x800 >> 0xc;
  auVar284._4_4_ = auVar190._4_4_ + 0x800 >> 0xc;
  auVar284._8_4_ = auVar190._8_4_ + 0x800 >> 0xc;
  auVar284._12_4_ = auVar190._12_4_ + 0x800 >> 0xc;
  auVar47._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar47._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar47._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar47._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar170 = packssdw(auVar284,auVar47);
  local_718 = auVar118._0_2_;
  uStack_716 = auVar118._2_2_;
  uStack_714 = auVar118._4_2_;
  uStack_712 = auVar118._6_2_;
  uStack_710 = auVar118._8_2_;
  uStack_70e = auVar118._10_2_;
  uStack_70c = auVar118._12_2_;
  uStack_70a = auVar118._14_2_;
  auVar229._0_12_ = auVar253._0_12_;
  auVar229._12_2_ = auVar253._6_2_;
  auVar229._14_2_ = uStack_712;
  auVar228._12_4_ = auVar229._12_4_;
  auVar228._0_10_ = auVar253._0_10_;
  auVar228._10_2_ = uStack_714;
  auVar227._10_6_ = auVar228._10_6_;
  auVar227._0_8_ = auVar253._0_8_;
  auVar227._8_2_ = auVar253._4_2_;
  auVar226._8_8_ = auVar227._8_8_;
  auVar226._6_2_ = uStack_716;
  auVar226._4_2_ = auVar253._2_2_;
  auVar226._0_2_ = auVar253._0_2_;
  auVar226._2_2_ = local_718;
  auVar140._2_2_ = uStack_710;
  auVar140._0_2_ = auVar253._8_2_;
  auVar140._4_2_ = auVar253._10_2_;
  auVar140._6_2_ = uStack_70e;
  auVar140._8_2_ = auVar253._12_2_;
  auVar140._10_2_ = uStack_70c;
  auVar140._12_2_ = auVar253._14_2_;
  auVar140._14_2_ = uStack_70a;
  auVar11 = pmaddwd(auVar226,auVar247);
  auVar84 = pmaddwd(auVar140,auVar247);
  auVar285._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar285._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar285._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar285._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar242._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar242._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar242._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar242._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar249 = packssdw(auVar285,auVar242);
  auVar11 = pmaddwd(auVar226,auVar103);
  auVar84 = pmaddwd(auVar140,auVar103);
  auVar230._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar230._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar230._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar230._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar141._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar141._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar141._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar141._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar404 = packssdw(auVar230,auVar141);
  local_728 = auVar120._0_2_;
  uStack_726 = auVar120._2_2_;
  uStack_724 = auVar120._4_2_;
  uStack_722 = auVar120._6_2_;
  uStack_720 = auVar120._8_2_;
  uStack_71e = auVar120._10_2_;
  uStack_71c = auVar120._12_2_;
  uStack_71a = auVar120._14_2_;
  auVar145._0_12_ = auVar255._0_12_;
  auVar145._12_2_ = auVar255._6_2_;
  auVar145._14_2_ = uStack_722;
  auVar144._12_4_ = auVar145._12_4_;
  auVar144._0_10_ = auVar255._0_10_;
  auVar144._10_2_ = uStack_724;
  auVar143._10_6_ = auVar144._10_6_;
  auVar143._0_8_ = auVar255._0_8_;
  auVar143._8_2_ = auVar255._4_2_;
  auVar142._8_8_ = auVar143._8_8_;
  auVar142._6_2_ = uStack_726;
  auVar142._4_2_ = auVar255._2_2_;
  auVar142._0_2_ = auVar255._0_2_;
  auVar142._2_2_ = local_728;
  auVar231._2_2_ = uStack_720;
  auVar231._0_2_ = auVar255._8_2_;
  auVar231._4_2_ = auVar255._10_2_;
  auVar231._6_2_ = uStack_71e;
  auVar231._8_2_ = auVar255._12_2_;
  auVar231._10_2_ = uStack_71c;
  auVar231._12_2_ = auVar255._14_2_;
  auVar231._14_2_ = uStack_71a;
  auVar11 = pmaddwd(auVar142,auVar247);
  auVar84 = pmaddwd(auVar231,auVar247);
  auVar286._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar286._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar286._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar286._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar244._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar244._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar244._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar244._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar248 = packssdw(auVar286,auVar244);
  auVar84 = pmaddwd(auVar142,auVar103);
  auVar11 = pmaddwd(auVar231,auVar103);
  auVar146._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar146._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar146._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar146._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar232._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar232._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar232._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar232._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar244 = packssdw(auVar146,auVar232);
  local_7a8 = auVar155._0_2_;
  uStack_7a6 = auVar155._2_2_;
  uStack_7a4 = auVar155._4_2_;
  uStack_7a2 = auVar155._6_2_;
  uStack_7a0 = auVar155._8_2_;
  uStack_79e = auVar155._10_2_;
  uStack_79c = auVar155._12_2_;
  uStack_79a = auVar155._14_2_;
  auVar150._0_12_ = auVar86._0_12_;
  auVar150._12_2_ = auVar86._6_2_;
  auVar150._14_2_ = uStack_7a2;
  auVar149._12_4_ = auVar150._12_4_;
  auVar149._0_10_ = auVar86._0_10_;
  auVar149._10_2_ = uStack_7a4;
  auVar148._10_6_ = auVar149._10_6_;
  auVar148._0_8_ = auVar86._0_8_;
  auVar148._8_2_ = auVar86._4_2_;
  auVar147._8_8_ = auVar148._8_8_;
  auVar147._6_2_ = uStack_7a6;
  auVar147._4_2_ = auVar86._2_2_;
  auVar147._0_2_ = auVar86._0_2_;
  auVar147._2_2_ = local_7a8;
  auVar287._2_2_ = uStack_7a0;
  auVar287._0_2_ = auVar86._8_2_;
  auVar287._4_2_ = auVar86._10_2_;
  auVar287._6_2_ = uStack_79e;
  auVar287._8_2_ = auVar86._12_2_;
  auVar287._10_2_ = uStack_79c;
  auVar287._12_2_ = auVar86._14_2_;
  auVar287._14_2_ = uStack_79a;
  auVar86 = pmaddwd(auVar147,auVar247);
  auVar84 = pmaddwd(auVar287,auVar247);
  auVar233._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar233._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar233._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar233._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar253._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar253._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar253._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar253._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar410 = packssdw(auVar233,auVar253);
  auVar84 = pmaddwd(auVar147,auVar103);
  auVar86 = pmaddwd(auVar287,auVar103);
  auVar151._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar151._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar151._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar151._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar288._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar288._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar288._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar288._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar253 = packssdw(auVar151,auVar288);
  local_798 = auVar13._0_2_;
  uStack_796 = auVar13._2_2_;
  uStack_794 = auVar13._4_2_;
  uStack_792 = auVar13._6_2_;
  uStack_790 = auVar13._8_2_;
  uStack_78e = auVar13._10_2_;
  uStack_78c = auVar13._12_2_;
  uStack_78a = auVar13._14_2_;
  auVar292._0_12_ = auVar82._0_12_;
  auVar292._12_2_ = auVar82._6_2_;
  auVar292._14_2_ = uStack_792;
  auVar294._12_4_ = auVar292._12_4_;
  auVar294._0_10_ = auVar82._0_10_;
  auVar294._10_2_ = uStack_794;
  auVar255._10_6_ = auVar294._10_6_;
  auVar255._0_8_ = auVar82._0_8_;
  auVar255._8_2_ = auVar82._4_2_;
  auVar257._8_8_ = auVar255._8_8_;
  auVar257._6_2_ = uStack_796;
  auVar257._4_2_ = auVar82._2_2_;
  auVar257._0_2_ = auVar82._0_2_;
  auVar257._2_2_ = local_798;
  auVar152._2_2_ = uStack_790;
  auVar152._0_2_ = auVar82._8_2_;
  auVar152._4_2_ = auVar82._10_2_;
  auVar152._6_2_ = uStack_78e;
  auVar152._8_2_ = auVar82._12_2_;
  auVar152._10_2_ = uStack_78c;
  auVar152._12_2_ = auVar82._14_2_;
  auVar152._14_2_ = uStack_78a;
  auVar11 = pmaddwd(auVar257,auVar247);
  auVar86 = pmaddwd(auVar247,auVar152);
  auVar84 = pmaddwd(auVar257,auVar103);
  auVar13 = pmaddwd(auVar152,auVar103);
  auVar289._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar289._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar289._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar289._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar48._0_4_ = auVar86._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar86._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar86._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar86._12_4_ + 0x800 >> 0xc;
  auVar292 = packssdw(auVar289,auVar48);
  auVar307._0_4_ = auVar84._0_4_ + 0x800 >> 0xc;
  auVar307._4_4_ = auVar84._4_4_ + 0x800 >> 0xc;
  auVar307._8_4_ = auVar84._8_4_ + 0x800 >> 0xc;
  auVar307._12_4_ = auVar84._12_4_ + 0x800 >> 0xc;
  auVar153._0_4_ = auVar13._0_4_ + 0x800 >> 0xc;
  auVar153._4_4_ = auVar13._4_4_ + 0x800 >> 0xc;
  auVar153._8_4_ = auVar13._8_4_ + 0x800 >> 0xc;
  auVar153._12_4_ = auVar13._12_4_ + 0x800 >> 0xc;
  auVar84 = packssdw(auVar307,auVar153);
  auVar255 = paddsw(auVar351,auVar72);
  auVar82 = psubsw(auVar351,auVar72);
  auVar257 = paddsw(auVar372,auVar331);
  auVar86 = psubsw(auVar372,auVar331);
  auVar118 = paddsw(auVar437,auVar339);
  auVar13 = psubsw(auVar437,auVar339);
  auVar120 = paddsw(auVar221,auVar220);
  auVar11 = psubsw(auVar221,auVar220);
  auVar155 = paddsw(auVar392,auVar219);
  auVar12 = psubsw(auVar392,auVar219);
  auVar190 = paddsw(auVar5,auVar393);
  auVar5 = psubsw(auVar5,auVar393);
  auVar240 = paddsw(auVar4,auVar131);
  auVar4 = psubsw(auVar4,auVar131);
  auVar242 = paddsw(auVar122,auVar130);
  auVar192 = psubsw(auVar122,auVar130);
  auVar343._0_12_ = auVar440._0_12_;
  auVar343._12_2_ = auVar440._6_2_;
  auVar343._14_2_ = auVar441._6_2_;
  auVar342._12_4_ = auVar343._12_4_;
  auVar342._0_10_ = auVar440._0_10_;
  auVar342._10_2_ = auVar441._4_2_;
  auVar341._10_6_ = auVar342._10_6_;
  auVar341._0_8_ = auVar440._0_8_;
  auVar341._8_2_ = auVar440._4_2_;
  auVar340._8_8_ = auVar341._8_8_;
  auVar340._6_2_ = auVar441._2_2_;
  auVar340._4_2_ = auVar440._2_2_;
  auVar340._0_2_ = auVar440._0_2_;
  auVar340._2_2_ = auVar441._0_2_;
  auVar357._2_2_ = auVar441._8_2_;
  auVar357._0_2_ = auVar440._8_2_;
  auVar357._4_2_ = auVar440._10_2_;
  auVar357._6_2_ = auVar441._10_2_;
  auVar357._8_2_ = auVar440._12_2_;
  auVar357._10_2_ = auVar441._12_2_;
  auVar357._12_2_ = auVar440._14_2_;
  auVar357._14_2_ = auVar441._14_2_;
  auVar72 = pmaddwd(auVar340,auVar311);
  auVar122 = pmaddwd(auVar357,auVar311);
  auVar380._0_4_ = auVar72._0_4_ + 0x800 >> 0xc;
  auVar380._4_4_ = auVar72._4_4_ + 0x800 >> 0xc;
  auVar380._8_4_ = auVar72._8_4_ + 0x800 >> 0xc;
  auVar380._12_4_ = auVar72._12_4_ + 0x800 >> 0xc;
  auVar331._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar331._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar331._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar331._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar392 = packssdw(auVar380,auVar331);
  auVar122 = pmaddwd(auVar340,auVar129);
  auVar72 = pmaddwd(auVar357,auVar129);
  auVar344._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar344._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar344._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar344._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar358._0_4_ = auVar72._0_4_ + 0x800 >> 0xc;
  auVar358._4_4_ = auVar72._4_4_ + 0x800 >> 0xc;
  auVar358._8_4_ = auVar72._8_4_ + 0x800 >> 0xc;
  auVar358._12_4_ = auVar72._12_4_ + 0x800 >> 0xc;
  auVar221 = packssdw(auVar344,auVar358);
  auVar429._0_12_ = auVar6._0_12_;
  auVar429._12_2_ = auVar6._6_2_;
  auVar429._14_2_ = auVar250._6_2_;
  auVar428._12_4_ = auVar429._12_4_;
  auVar428._0_10_ = auVar6._0_10_;
  auVar428._10_2_ = auVar250._4_2_;
  auVar427._10_6_ = auVar428._10_6_;
  auVar427._0_8_ = auVar6._0_8_;
  auVar427._8_2_ = auVar6._4_2_;
  auVar426._8_8_ = auVar427._8_8_;
  auVar426._6_2_ = auVar250._2_2_;
  auVar426._4_2_ = auVar6._2_2_;
  auVar426._0_2_ = auVar6._0_2_;
  auVar426._2_2_ = auVar250._0_2_;
  auVar49._2_2_ = auVar250._8_2_;
  auVar49._0_2_ = auVar6._8_2_;
  auVar49._4_2_ = auVar6._10_2_;
  auVar49._6_2_ = auVar250._10_2_;
  auVar49._8_2_ = auVar6._12_2_;
  auVar49._10_2_ = auVar250._12_2_;
  auVar49._12_2_ = auVar6._14_2_;
  auVar49._14_2_ = auVar250._14_2_;
  auVar6 = pmaddwd(auVar426,auVar311);
  auVar122 = pmaddwd(auVar49,auVar311);
  auVar304._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar304._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar304._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar304._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar351._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar351._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar351._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar351._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar441 = packssdw(auVar304,auVar351);
  auVar6 = pmaddwd(auVar426,auVar129);
  auVar122 = pmaddwd(auVar49,auVar129);
  auVar430._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar430._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar430._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar430._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar50._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar393 = packssdw(auVar430,auVar50);
  local_588 = auVar167._0_2_;
  uStack_586 = auVar167._2_2_;
  uStack_584 = auVar167._4_2_;
  uStack_582 = auVar167._6_2_;
  uStack_580 = auVar167._8_2_;
  uStack_57e = auVar167._10_2_;
  uStack_57c = auVar167._12_2_;
  uStack_57a = auVar167._14_2_;
  auVar54._0_12_ = auVar159._0_12_;
  auVar54._12_2_ = auVar159._6_2_;
  auVar54._14_2_ = uStack_582;
  auVar53._12_4_ = auVar54._12_4_;
  auVar53._0_10_ = auVar159._0_10_;
  auVar53._10_2_ = uStack_584;
  auVar52._10_6_ = auVar53._10_6_;
  auVar52._0_8_ = auVar159._0_8_;
  auVar52._8_2_ = auVar159._4_2_;
  auVar51._8_8_ = auVar52._8_8_;
  auVar51._6_2_ = uStack_586;
  auVar51._4_2_ = auVar159._2_2_;
  auVar51._0_2_ = auVar159._0_2_;
  auVar51._2_2_ = local_588;
  auVar359._2_2_ = uStack_580;
  auVar359._0_2_ = auVar159._8_2_;
  auVar359._4_2_ = auVar159._10_2_;
  auVar359._6_2_ = uStack_57e;
  auVar359._8_2_ = auVar159._12_2_;
  auVar359._10_2_ = uStack_57c;
  auVar359._12_2_ = auVar159._14_2_;
  auVar359._14_2_ = uStack_57a;
  auVar6 = pmaddwd(auVar51,auVar311);
  auVar122 = pmaddwd(auVar359,auVar311);
  auVar182._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar182._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar182._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar182._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar372._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar372._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar372._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar372._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar437 = packssdw(auVar182,auVar372);
  auVar122 = pmaddwd(auVar51,auVar129);
  auVar6 = pmaddwd(auVar359,auVar129);
  auVar55._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar360._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar360._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar360._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar360._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar159 = packssdw(auVar55,auVar360);
  local_578 = auVar166._0_2_;
  uStack_576 = auVar166._2_2_;
  uStack_574 = auVar166._4_2_;
  uStack_572 = auVar166._6_2_;
  uStack_570 = auVar166._8_2_;
  uStack_56e = auVar166._10_2_;
  uStack_56c = auVar166._12_2_;
  uStack_56a = auVar166._14_2_;
  auVar364._0_12_ = auVar157._0_12_;
  auVar364._12_2_ = auVar157._6_2_;
  auVar364._14_2_ = uStack_572;
  auVar363._12_4_ = auVar364._12_4_;
  auVar363._0_10_ = auVar157._0_10_;
  auVar363._10_2_ = uStack_574;
  auVar362._10_6_ = auVar363._10_6_;
  auVar362._0_8_ = auVar157._0_8_;
  auVar362._8_2_ = auVar157._4_2_;
  auVar361._8_8_ = auVar362._8_8_;
  auVar361._6_2_ = uStack_576;
  auVar361._4_2_ = auVar157._2_2_;
  auVar361._0_2_ = auVar157._0_2_;
  auVar361._2_2_ = local_578;
  auVar417._2_2_ = uStack_570;
  auVar417._0_2_ = auVar157._8_2_;
  auVar417._4_2_ = auVar157._10_2_;
  auVar417._6_2_ = uStack_56e;
  auVar417._8_2_ = auVar157._12_2_;
  auVar417._10_2_ = uStack_56c;
  auVar417._12_2_ = auVar157._14_2_;
  auVar417._14_2_ = uStack_56a;
  auVar122 = pmaddwd(auVar361,auVar311);
  auVar6 = pmaddwd(auVar417,auVar311);
  auVar115._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar115._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar115._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar115._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar442._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar442._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar442._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar442._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar157 = packssdw(auVar115,auVar442);
  auVar122 = pmaddwd(auVar361,auVar129);
  auVar6 = pmaddwd(auVar417,auVar129);
  auVar365._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar365._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar365._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar365._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar418._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar418._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar418._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar418._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar339 = packssdw(auVar365,auVar418);
  auVar394 = paddsw(auVar74,auVar78);
  auVar122 = psubsw(auVar74,auVar78);
  auVar398 = paddsw(auVar83,auVar80);
  auVar83 = psubsw(auVar83,auVar80);
  auVar416 = paddsw(auVar76,auVar389);
  auVar6 = psubsw(auVar76,auVar389);
  auVar389 = paddsw(auVar85,auVar87);
  auVar85 = psubsw(auVar85,auVar87);
  auVar443 = paddsw(auVar188,auVar292);
  auVar87 = psubsw(auVar188,auVar292);
  auVar440 = paddsw(auVar298,auVar410);
  auVar72 = psubsw(auVar298,auVar410);
  auVar220 = paddsw(auVar314,auVar248);
  auVar292 = psubsw(auVar314,auVar248);
  auVar248 = paddsw(auVar379,auVar249);
  auVar167 = psubsw(auVar379,auVar249);
  auVar410 = psubsw(auVar387,auVar356);
  auVar74 = paddsw(auVar387,auVar356);
  auVar166 = psubsw(auVar422,auVar390);
  auVar76 = paddsw(auVar422,auVar390);
  auVar131 = psubsw(auVar2,auVar88);
  auVar88 = paddsw(auVar2,auVar88);
  auVar130 = psubsw(auVar3,auVar391);
  auVar2 = paddsw(auVar3,auVar391);
  auVar314 = psubsw(auVar267,auVar84);
  auVar294 = paddsw(auVar84,auVar267);
  auVar219 = psubsw(auVar168,auVar253);
  auVar253 = paddsw(auVar253,auVar168);
  auVar422 = psubsw(auVar169,auVar244);
  auVar244 = paddsw(auVar244,auVar169);
  auVar387 = psubsw(auVar170,auVar404);
  auVar307 = paddsw(auVar404,auVar170);
  auVar331 = paddsw(auVar255,auVar8);
  auVar249 = psubsw(auVar255,auVar8);
  auVar255 = paddsw(auVar257,auVar9);
  auVar250 = psubsw(auVar257,auVar9);
  auVar257 = paddsw(auVar118,auVar251);
  auVar267 = psubsw(auVar118,auVar251);
  auVar298 = paddsw(auVar120,auVar10);
  auVar351 = psubsw(auVar120,auVar10);
  auVar372 = paddsw(auVar155,auVar221);
  auVar251 = psubsw(auVar155,auVar221);
  auVar170 = paddsw(auVar190,auVar393);
  auVar84 = psubsw(auVar190,auVar393);
  auVar221 = paddsw(auVar240,auVar159);
  auVar3 = psubsw(auVar240,auVar159);
  auVar78 = paddsw(auVar242,auVar339);
  auVar8 = psubsw(auVar242,auVar339);
  auVar80 = paddsw(auVar192,auVar157);
  auVar9 = psubsw(auVar192,auVar157);
  auVar118 = paddsw(auVar4,auVar437);
  auVar4 = psubsw(auVar4,auVar437);
  auVar120 = paddsw(auVar5,auVar441);
  auVar5 = psubsw(auVar5,auVar441);
  auVar155 = paddsw(auVar12,auVar392);
  auVar10 = psubsw(auVar12,auVar392);
  auVar190 = paddsw(auVar11,auVar7);
  auVar12 = psubsw(auVar11,auVar7);
  auVar157 = paddsw(auVar13,auVar388);
  auVar13 = psubsw(auVar13,auVar388);
  auVar159 = paddsw(auVar86,auVar355);
  auVar86 = psubsw(auVar86,auVar355);
  auVar188 = paddsw(auVar82,auVar299);
  auVar7 = psubsw(auVar82,auVar299);
  auVar348._0_12_ = auVar167._0_12_;
  auVar348._12_2_ = auVar167._6_2_;
  auVar348._14_2_ = auVar387._6_2_;
  auVar347._12_4_ = auVar348._12_4_;
  auVar347._0_10_ = auVar167._0_10_;
  auVar347._10_2_ = auVar387._4_2_;
  auVar346._10_6_ = auVar347._10_6_;
  auVar346._0_8_ = auVar167._0_8_;
  auVar346._8_2_ = auVar167._4_2_;
  auVar345._8_8_ = auVar346._8_8_;
  auVar345._6_2_ = auVar387._2_2_;
  auVar345._4_2_ = auVar167._2_2_;
  auVar345._0_2_ = auVar167._0_2_;
  auVar345._2_2_ = auVar387._0_2_;
  auVar323._2_2_ = auVar387._8_2_;
  auVar323._0_2_ = auVar167._8_2_;
  auVar323._4_2_ = auVar167._10_2_;
  auVar323._6_2_ = auVar387._10_2_;
  auVar323._8_2_ = auVar167._12_2_;
  auVar323._10_2_ = auVar387._12_2_;
  auVar323._12_2_ = auVar167._14_2_;
  auVar323._14_2_ = auVar387._14_2_;
  auVar82 = pmaddwd(auVar345,auVar311);
  auVar11 = pmaddwd(auVar323,auVar311);
  auVar56._0_4_ = auVar82._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar82._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar82._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar82._12_4_ + 0x800 >> 0xc;
  auVar387._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar387._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar387._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar387._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar82 = packssdw(auVar56,auVar387);
  auVar192 = pmaddwd(auVar345,auVar129);
  auVar11 = pmaddwd(auVar323,auVar129);
  auVar349._0_4_ = auVar192._0_4_ + 0x800 >> 0xc;
  auVar349._4_4_ = auVar192._4_4_ + 0x800 >> 0xc;
  auVar349._8_4_ = auVar192._8_4_ + 0x800 >> 0xc;
  auVar349._12_4_ = auVar192._12_4_ + 0x800 >> 0xc;
  auVar324._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar324._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar324._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar324._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar299 = packssdw(auVar349,auVar324);
  auVar447._0_12_ = auVar292._0_12_;
  auVar447._12_2_ = auVar292._6_2_;
  auVar447._14_2_ = auVar422._6_2_;
  auVar446._12_4_ = auVar447._12_4_;
  auVar446._0_10_ = auVar292._0_10_;
  auVar446._10_2_ = auVar422._4_2_;
  auVar445._10_6_ = auVar446._10_6_;
  auVar445._0_8_ = auVar292._0_8_;
  auVar445._8_2_ = auVar292._4_2_;
  auVar444._8_8_ = auVar445._8_8_;
  auVar444._6_2_ = auVar422._2_2_;
  auVar444._4_2_ = auVar292._2_2_;
  auVar444._0_2_ = auVar292._0_2_;
  auVar444._2_2_ = auVar422._0_2_;
  auVar57._2_2_ = auVar422._8_2_;
  auVar57._0_2_ = auVar292._8_2_;
  auVar57._4_2_ = auVar292._10_2_;
  auVar57._6_2_ = auVar422._10_2_;
  auVar57._8_2_ = auVar292._12_2_;
  auVar57._10_2_ = auVar422._12_2_;
  auVar57._12_2_ = auVar292._14_2_;
  auVar57._14_2_ = auVar422._14_2_;
  auVar192 = pmaddwd(auVar444,auVar311);
  auVar11 = pmaddwd(auVar57,auVar311);
  auVar183._0_4_ = auVar192._0_4_ + 0x800 >> 0xc;
  auVar183._4_4_ = auVar192._4_4_ + 0x800 >> 0xc;
  auVar183._8_4_ = auVar192._8_4_ + 0x800 >> 0xc;
  auVar183._12_4_ = auVar192._12_4_ + 0x800 >> 0xc;
  auVar422._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar422._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar422._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar422._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar192 = packssdw(auVar183,auVar422);
  auVar240 = pmaddwd(auVar444,auVar129);
  auVar11 = pmaddwd(auVar57,auVar129);
  auVar448._0_4_ = auVar240._0_4_ + 0x800 >> 0xc;
  auVar448._4_4_ = auVar240._4_4_ + 0x800 >> 0xc;
  auVar448._8_4_ = auVar240._8_4_ + 0x800 >> 0xc;
  auVar448._12_4_ = auVar240._12_4_ + 0x800 >> 0xc;
  auVar58._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar58._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar58._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar58._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar388 = packssdw(auVar448,auVar58);
  auVar434._0_12_ = auVar72._0_12_;
  auVar434._12_2_ = auVar72._6_2_;
  auVar434._14_2_ = auVar219._6_2_;
  auVar433._12_4_ = auVar434._12_4_;
  auVar433._0_10_ = auVar72._0_10_;
  auVar433._10_2_ = auVar219._4_2_;
  auVar432._10_6_ = auVar433._10_6_;
  auVar432._0_8_ = auVar72._0_8_;
  auVar432._8_2_ = auVar72._4_2_;
  auVar431._8_8_ = auVar432._8_8_;
  auVar431._6_2_ = auVar219._2_2_;
  auVar431._4_2_ = auVar72._2_2_;
  auVar431._0_2_ = auVar72._0_2_;
  auVar431._2_2_ = auVar219._0_2_;
  auVar59._2_2_ = auVar219._8_2_;
  auVar59._0_2_ = auVar72._8_2_;
  auVar59._4_2_ = auVar72._10_2_;
  auVar59._6_2_ = auVar219._10_2_;
  auVar59._8_2_ = auVar72._12_2_;
  auVar59._10_2_ = auVar219._12_2_;
  auVar59._12_2_ = auVar72._14_2_;
  auVar59._14_2_ = auVar219._14_2_;
  auVar72 = pmaddwd(auVar431,auVar311);
  auVar11 = pmaddwd(auVar59,auVar311);
  auVar184._0_4_ = auVar72._0_4_ + 0x800 >> 0xc;
  auVar184._4_4_ = auVar72._4_4_ + 0x800 >> 0xc;
  auVar184._8_4_ = auVar72._8_4_ + 0x800 >> 0xc;
  auVar184._12_4_ = auVar72._12_4_ + 0x800 >> 0xc;
  auVar437._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar437._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar437._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar437._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar72 = packssdw(auVar184,auVar437);
  auVar240 = pmaddwd(auVar431,auVar129);
  auVar11 = pmaddwd(auVar59,auVar129);
  auVar435._0_4_ = auVar240._0_4_ + 0x800 >> 0xc;
  auVar435._4_4_ = auVar240._4_4_ + 0x800 >> 0xc;
  auVar435._8_4_ = auVar240._8_4_ + 0x800 >> 0xc;
  auVar435._12_4_ = auVar240._12_4_ + 0x800 >> 0xc;
  auVar60._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar355 = packssdw(auVar435,auVar60);
  auVar369._0_12_ = auVar87._0_12_;
  auVar369._12_2_ = auVar87._6_2_;
  auVar369._14_2_ = auVar314._6_2_;
  auVar368._12_4_ = auVar369._12_4_;
  auVar368._0_10_ = auVar87._0_10_;
  auVar368._10_2_ = auVar314._4_2_;
  auVar367._10_6_ = auVar368._10_6_;
  auVar367._0_8_ = auVar87._0_8_;
  auVar367._8_2_ = auVar87._4_2_;
  auVar366._8_8_ = auVar367._8_8_;
  auVar366._6_2_ = auVar314._2_2_;
  auVar366._4_2_ = auVar87._2_2_;
  auVar366._0_2_ = auVar87._0_2_;
  auVar366._2_2_ = auVar314._0_2_;
  auVar61._2_2_ = auVar314._8_2_;
  auVar61._0_2_ = auVar87._8_2_;
  auVar61._4_2_ = auVar87._10_2_;
  auVar61._6_2_ = auVar314._10_2_;
  auVar61._8_2_ = auVar87._12_2_;
  auVar61._10_2_ = auVar314._12_2_;
  auVar61._12_2_ = auVar87._14_2_;
  auVar61._14_2_ = auVar314._14_2_;
  auVar11 = pmaddwd(auVar366,auVar311);
  auVar87 = pmaddwd(auVar61,auVar311);
  auVar185._0_4_ = auVar11._0_4_ + 0x800 >> 0xc;
  auVar185._4_4_ = auVar11._4_4_ + 0x800 >> 0xc;
  auVar185._8_4_ = auVar11._8_4_ + 0x800 >> 0xc;
  auVar185._12_4_ = auVar11._12_4_ + 0x800 >> 0xc;
  auVar219._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar219._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar219._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar219._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar11 = packssdw(auVar185,auVar219);
  auVar240 = pmaddwd(auVar366,auVar129);
  auVar87 = pmaddwd(auVar61,auVar129);
  auVar370._0_4_ = auVar240._0_4_ + 0x800 >> 0xc;
  auVar370._4_4_ = auVar240._4_4_ + 0x800 >> 0xc;
  auVar370._8_4_ = auVar240._8_4_ + 0x800 >> 0xc;
  auVar370._12_4_ = auVar240._12_4_ + 0x800 >> 0xc;
  auVar62._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar62._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar62._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar62._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar422 = packssdw(auVar370,auVar62);
  local_598 = auVar130._0_2_;
  uStack_596 = auVar130._2_2_;
  uStack_594 = auVar130._4_2_;
  uStack_592 = auVar130._6_2_;
  uStack_590 = auVar130._8_2_;
  uStack_58e = auVar130._10_2_;
  uStack_58c = auVar130._12_2_;
  uStack_58a = auVar130._14_2_;
  auVar328._0_12_ = auVar85._0_12_;
  auVar328._12_2_ = auVar85._6_2_;
  auVar328._14_2_ = uStack_592;
  auVar327._12_4_ = auVar328._12_4_;
  auVar327._0_10_ = auVar85._0_10_;
  auVar327._10_2_ = uStack_594;
  auVar326._10_6_ = auVar327._10_6_;
  auVar326._0_8_ = auVar85._0_8_;
  auVar326._8_2_ = auVar85._4_2_;
  auVar325._8_8_ = auVar326._8_8_;
  auVar325._6_2_ = uStack_596;
  auVar325._4_2_ = auVar85._2_2_;
  auVar325._0_2_ = auVar85._0_2_;
  auVar325._2_2_ = local_598;
  auVar63._2_2_ = uStack_590;
  auVar63._0_2_ = auVar85._8_2_;
  auVar63._4_2_ = auVar85._10_2_;
  auVar63._6_2_ = uStack_58e;
  auVar63._8_2_ = auVar85._12_2_;
  auVar63._10_2_ = uStack_58c;
  auVar63._12_2_ = auVar85._14_2_;
  auVar63._14_2_ = uStack_58a;
  auVar87 = pmaddwd(auVar325,auVar311);
  auVar85 = pmaddwd(auVar63,auVar311);
  auVar305._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar305._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar305._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar305._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar130._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar130._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar130._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar130._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar292 = packssdw(auVar305,auVar130);
  auVar87 = pmaddwd(auVar325,auVar129);
  auVar85 = pmaddwd(auVar63,auVar129);
  auVar329._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar329._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar329._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar329._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar64._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar64._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar64._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar64._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar387 = packssdw(auVar329,auVar64);
  local_588 = auVar131._0_2_;
  uStack_586 = auVar131._2_2_;
  uStack_584 = auVar131._4_2_;
  uStack_582 = auVar131._6_2_;
  uStack_580 = auVar131._8_2_;
  uStack_57e = auVar131._10_2_;
  uStack_57c = auVar131._12_2_;
  uStack_57a = auVar131._14_2_;
  auVar237._0_12_ = auVar6._0_12_;
  auVar237._12_2_ = auVar6._6_2_;
  auVar237._14_2_ = uStack_582;
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._0_10_ = auVar6._0_10_;
  auVar236._10_2_ = uStack_584;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._0_8_ = auVar6._0_8_;
  auVar235._8_2_ = auVar6._4_2_;
  auVar234._8_8_ = auVar235._8_8_;
  auVar234._6_2_ = uStack_586;
  auVar234._4_2_ = auVar6._2_2_;
  auVar234._0_2_ = auVar6._0_2_;
  auVar234._2_2_ = local_588;
  auVar65._2_2_ = uStack_580;
  auVar65._0_2_ = auVar6._8_2_;
  auVar65._4_2_ = auVar6._10_2_;
  auVar65._6_2_ = uStack_57e;
  auVar65._8_2_ = auVar6._12_2_;
  auVar65._10_2_ = uStack_57c;
  auVar65._12_2_ = auVar6._14_2_;
  auVar65._14_2_ = uStack_57a;
  auVar87 = pmaddwd(auVar234,auVar311);
  auVar85 = pmaddwd(auVar65,auVar311);
  auVar290._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar290._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar290._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar290._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar131._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar131._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar131._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar131._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar242 = packssdw(auVar290,auVar131);
  auVar87 = pmaddwd(auVar234,auVar129);
  auVar85 = pmaddwd(auVar65,auVar129);
  auVar238._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar238._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar238._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar238._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar66._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar240 = packssdw(auVar238,auVar66);
  local_578 = auVar166._0_2_;
  uStack_576 = auVar166._2_2_;
  uStack_574 = auVar166._4_2_;
  uStack_572 = auVar166._6_2_;
  uStack_570 = auVar166._8_2_;
  uStack_56e = auVar166._10_2_;
  uStack_56c = auVar166._12_2_;
  uStack_56a = auVar166._14_2_;
  auVar384._0_12_ = auVar83._0_12_;
  auVar384._12_2_ = auVar83._6_2_;
  auVar384._14_2_ = uStack_572;
  auVar383._12_4_ = auVar384._12_4_;
  auVar383._0_10_ = auVar83._0_10_;
  auVar383._10_2_ = uStack_574;
  auVar382._10_6_ = auVar383._10_6_;
  auVar382._0_8_ = auVar83._0_8_;
  auVar382._8_2_ = auVar83._4_2_;
  auVar381._8_8_ = auVar382._8_8_;
  auVar381._6_2_ = uStack_576;
  auVar381._4_2_ = auVar83._2_2_;
  auVar381._0_2_ = auVar83._0_2_;
  auVar381._2_2_ = local_578;
  auVar67._2_2_ = uStack_570;
  auVar67._0_2_ = auVar83._8_2_;
  auVar67._4_2_ = auVar83._10_2_;
  auVar67._6_2_ = uStack_56e;
  auVar67._8_2_ = auVar83._12_2_;
  auVar67._10_2_ = uStack_56c;
  auVar67._12_2_ = auVar83._14_2_;
  auVar67._14_2_ = uStack_56a;
  auVar85 = pmaddwd(auVar381,auVar311);
  auVar83 = pmaddwd(auVar67,auVar311);
  auVar186._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar186._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar186._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar186._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar404._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar404._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar404._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar404._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar6 = packssdw(auVar186,auVar404);
  auVar85 = pmaddwd(auVar381,auVar129);
  auVar83 = pmaddwd(auVar67,auVar129);
  auVar385._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar385._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar385._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar385._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar68._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar437 = packssdw(auVar385,auVar68);
  local_568 = auVar410._0_2_;
  uStack_566 = auVar410._2_2_;
  uStack_564 = auVar410._4_2_;
  uStack_562 = auVar410._6_2_;
  uStack_560 = auVar410._8_2_;
  uStack_55e = auVar410._10_2_;
  uStack_55c = auVar410._12_2_;
  uStack_55a = auVar410._14_2_;
  auVar168._0_12_ = auVar122._0_12_;
  auVar168._12_2_ = auVar122._6_2_;
  auVar168._14_2_ = uStack_562;
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._0_10_ = auVar122._0_10_;
  auVar167._10_2_ = uStack_564;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._0_8_ = auVar122._0_8_;
  auVar166._8_2_ = auVar122._4_2_;
  auVar410._8_8_ = auVar166._8_8_;
  auVar410._6_2_ = uStack_566;
  auVar410._4_2_ = auVar122._2_2_;
  auVar410._0_2_ = auVar122._0_2_;
  auVar410._2_2_ = local_568;
  auVar69._2_2_ = uStack_560;
  auVar69._0_2_ = auVar122._8_2_;
  auVar69._4_2_ = auVar122._10_2_;
  auVar69._6_2_ = uStack_55e;
  auVar69._8_2_ = auVar122._12_2_;
  auVar69._10_2_ = uStack_55c;
  auVar69._12_2_ = auVar122._14_2_;
  auVar69._14_2_ = uStack_55a;
  auVar85 = pmaddwd(auVar410,auVar311);
  auVar87 = pmaddwd(auVar311,auVar69);
  auVar83 = pmaddwd(auVar410,auVar129);
  auVar122 = pmaddwd(auVar69,auVar129);
  auVar70._0_4_ = auVar85._0_4_ + 0x800 >> 0xc;
  auVar70._4_4_ = auVar85._4_4_ + 0x800 >> 0xc;
  auVar70._8_4_ = auVar85._8_4_ + 0x800 >> 0xc;
  auVar70._12_4_ = auVar85._12_4_ + 0x800 >> 0xc;
  auVar116._0_4_ = auVar87._0_4_ + 0x800 >> 0xc;
  auVar116._4_4_ = auVar87._4_4_ + 0x800 >> 0xc;
  auVar116._8_4_ = auVar87._8_4_ + 0x800 >> 0xc;
  auVar116._12_4_ = auVar87._12_4_ + 0x800 >> 0xc;
  auVar85 = packssdw(auVar70,auVar116);
  auVar169._0_4_ = auVar83._0_4_ + 0x800 >> 0xc;
  auVar169._4_4_ = auVar83._4_4_ + 0x800 >> 0xc;
  auVar169._8_4_ = auVar83._8_4_ + 0x800 >> 0xc;
  auVar169._12_4_ = auVar83._12_4_ + 0x800 >> 0xc;
  auVar419._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar419._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar419._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar419._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar83 = packssdw(auVar169,auVar419);
  alVar420 = (__m128i)paddsw(auVar331,auVar74);
  *output = alVar420;
  alVar420 = (__m128i)psubsw(auVar331,auVar74);
  output[0x3f] = alVar420;
  alVar420 = (__m128i)paddsw(auVar255,auVar76);
  output[1] = alVar420;
  alVar420 = (__m128i)psubsw(auVar255,auVar76);
  output[0x3e] = alVar420;
  alVar420 = (__m128i)paddsw(auVar257,auVar88);
  output[2] = alVar420;
  alVar420 = (__m128i)psubsw(auVar257,auVar88);
  output[0x3d] = alVar420;
  alVar420 = (__m128i)paddsw(auVar298,auVar2);
  output[3] = alVar420;
  alVar420 = (__m128i)psubsw(auVar298,auVar2);
  output[0x3c] = alVar420;
  alVar420 = (__m128i)paddsw(auVar372,auVar294);
  output[4] = alVar420;
  alVar420 = (__m128i)psubsw(auVar372,auVar294);
  output[0x3b] = alVar420;
  alVar420 = (__m128i)paddsw(auVar170,auVar253);
  output[5] = alVar420;
  alVar420 = (__m128i)psubsw(auVar170,auVar253);
  output[0x3a] = alVar420;
  alVar420 = (__m128i)paddsw(auVar221,auVar244);
  output[6] = alVar420;
  alVar420 = (__m128i)psubsw(auVar221,auVar244);
  output[0x39] = alVar420;
  alVar420 = (__m128i)paddsw(auVar78,auVar307);
  output[7] = alVar420;
  alVar420 = (__m128i)psubsw(auVar78,auVar307);
  output[0x38] = alVar420;
  alVar420 = (__m128i)paddsw(auVar80,auVar299);
  output[8] = alVar420;
  alVar420 = (__m128i)psubsw(auVar80,auVar299);
  output[0x37] = alVar420;
  alVar420 = (__m128i)paddsw(auVar118,auVar388);
  output[9] = alVar420;
  alVar420 = (__m128i)psubsw(auVar118,auVar388);
  output[0x36] = alVar420;
  alVar420 = (__m128i)paddsw(auVar120,auVar355);
  output[10] = alVar420;
  alVar420 = (__m128i)psubsw(auVar120,auVar355);
  output[0x35] = alVar420;
  alVar420 = (__m128i)paddsw(auVar155,auVar422);
  output[0xb] = alVar420;
  alVar420 = (__m128i)psubsw(auVar155,auVar422);
  output[0x34] = alVar420;
  alVar420 = (__m128i)paddsw(auVar190,auVar387);
  output[0xc] = alVar420;
  alVar420 = (__m128i)psubsw(auVar190,auVar387);
  output[0x33] = alVar420;
  alVar420 = (__m128i)paddsw(auVar157,auVar240);
  output[0xd] = alVar420;
  alVar420 = (__m128i)psubsw(auVar157,auVar240);
  output[0x32] = alVar420;
  alVar420 = (__m128i)paddsw(auVar159,auVar437);
  output[0xe] = alVar420;
  alVar420 = (__m128i)psubsw(auVar159,auVar437);
  output[0x31] = alVar420;
  alVar420 = (__m128i)paddsw(auVar188,auVar83);
  output[0xf] = alVar420;
  alVar420 = (__m128i)psubsw(auVar188,auVar83);
  output[0x30] = alVar420;
  alVar420 = (__m128i)paddsw(auVar7,auVar85);
  output[0x10] = alVar420;
  alVar420 = (__m128i)psubsw(auVar7,auVar85);
  output[0x2f] = alVar420;
  alVar420 = (__m128i)paddsw(auVar86,auVar6);
  output[0x11] = alVar420;
  alVar420 = (__m128i)psubsw(auVar86,auVar6);
  output[0x2e] = alVar420;
  alVar420 = (__m128i)paddsw(auVar13,auVar242);
  output[0x12] = alVar420;
  alVar420 = (__m128i)psubsw(auVar13,auVar242);
  output[0x2d] = alVar420;
  alVar420 = (__m128i)paddsw(auVar12,auVar292);
  output[0x13] = alVar420;
  alVar420 = (__m128i)psubsw(auVar12,auVar292);
  output[0x2c] = alVar420;
  alVar420 = (__m128i)paddsw(auVar10,auVar11);
  output[0x14] = alVar420;
  alVar420 = (__m128i)psubsw(auVar10,auVar11);
  output[0x2b] = alVar420;
  alVar420 = (__m128i)paddsw(auVar5,auVar72);
  output[0x15] = alVar420;
  alVar420 = (__m128i)psubsw(auVar5,auVar72);
  output[0x2a] = alVar420;
  alVar420 = (__m128i)paddsw(auVar4,auVar192);
  output[0x16] = alVar420;
  alVar420 = (__m128i)psubsw(auVar4,auVar192);
  output[0x29] = alVar420;
  alVar420 = (__m128i)paddsw(auVar9,auVar82);
  output[0x17] = alVar420;
  alVar420 = (__m128i)psubsw(auVar9,auVar82);
  output[0x28] = alVar420;
  alVar420 = (__m128i)paddsw(auVar8,auVar248);
  output[0x18] = alVar420;
  alVar420 = (__m128i)psubsw(auVar8,auVar248);
  output[0x27] = alVar420;
  alVar420 = (__m128i)paddsw(auVar3,auVar220);
  output[0x19] = alVar420;
  alVar420 = (__m128i)psubsw(auVar3,auVar220);
  output[0x26] = alVar420;
  alVar420 = (__m128i)paddsw(auVar84,auVar440);
  output[0x1a] = alVar420;
  alVar420 = (__m128i)psubsw(auVar84,auVar440);
  output[0x25] = alVar420;
  alVar420 = (__m128i)paddsw(auVar251,auVar443);
  output[0x1b] = alVar420;
  alVar420 = (__m128i)psubsw(auVar251,auVar443);
  output[0x24] = alVar420;
  alVar420 = (__m128i)paddsw(auVar351,auVar389);
  output[0x1c] = alVar420;
  alVar420 = (__m128i)psubsw(auVar351,auVar389);
  output[0x23] = alVar420;
  alVar420 = (__m128i)paddsw(auVar267,auVar416);
  output[0x1d] = alVar420;
  alVar420 = (__m128i)psubsw(auVar267,auVar416);
  output[0x22] = alVar420;
  alVar420 = (__m128i)paddsw(auVar250,auVar398);
  output[0x1e] = alVar420;
  alVar420 = (__m128i)psubsw(auVar250,auVar398);
  output[0x21] = alVar420;
  alVar420 = (__m128i)paddsw(auVar249,auVar394);
  output[0x1f] = alVar420;
  alVar420 = (__m128i)psubsw(auVar249,auVar394);
  output[0x20] = alVar420;
  return;
}

Assistant:

static void idct64_low32_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_ssse3(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_ssse3(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_ssse3(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_ssse3(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_ssse3(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_ssse3(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_sse2(x[32], x[33]);
  btf_16_subs_adds_sse2(x[35], x[34]);
  btf_16_adds_subs_sse2(x[36], x[37]);
  btf_16_subs_adds_sse2(x[39], x[38]);
  btf_16_adds_subs_sse2(x[40], x[41]);
  btf_16_subs_adds_sse2(x[43], x[42]);
  btf_16_adds_subs_sse2(x[44], x[45]);
  btf_16_subs_adds_sse2(x[47], x[46]);
  btf_16_adds_subs_sse2(x[48], x[49]);
  btf_16_subs_adds_sse2(x[51], x[50]);
  btf_16_adds_subs_sse2(x[52], x[53]);
  btf_16_subs_adds_sse2(x[55], x[54]);
  btf_16_adds_subs_sse2(x[56], x[57]);
  btf_16_subs_adds_sse2(x[59], x[58]);
  btf_16_adds_subs_sse2(x[60], x[61]);
  btf_16_subs_adds_sse2(x[63], x[62]);

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_sse2(x[16], x[17]);
  btf_16_subs_adds_sse2(x[19], x[18]);
  btf_16_adds_subs_sse2(x[20], x[21]);
  btf_16_subs_adds_sse2(x[23], x[22]);
  btf_16_adds_subs_sse2(x[24], x[25]);
  btf_16_subs_adds_sse2(x[27], x[26]);
  btf_16_adds_subs_sse2(x[28], x[29]);
  btf_16_subs_adds_sse2(x[31], x[30]);
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 9~11
  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}